

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx512::CurveNiMBIntersector1<4>::
     intersect_h<embree::avx512::RibbonCurve1Intersector1<embree::HermiteCurveT,8>,embree::avx512::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [16];
  int iVar8;
  __int_type_conflict _Var9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  ulong uVar20;
  undefined8 uVar21;
  uint uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  byte bVar55;
  ulong uVar56;
  uint uVar57;
  uint uVar58;
  long lVar59;
  Geometry *pGVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  byte bVar64;
  uint uVar65;
  ulong uVar66;
  float fVar67;
  float fVar130;
  float fVar131;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar86 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  float fVar134;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar132;
  float fVar133;
  float fVar135;
  float fVar136;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined4 uVar137;
  vint4 bi_2;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined8 uVar147;
  vint4 bi_1;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  float fVar155;
  float fVar166;
  float fVar167;
  vint4 bi;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar168;
  float fVar169;
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  vint4 ai;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [64];
  vint4 ai_1;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  vint4 ai_2;
  undefined1 auVar191 [16];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  float fVar196;
  float fVar197;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar198;
  float fVar199;
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar206;
  float fVar207;
  undefined1 auVar205 [32];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [64];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  undefined1 auVar221 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  int local_554;
  ulong local_550;
  ulong local_548;
  RayQueryContext *local_540;
  ulong local_538;
  Primitive *local_530;
  Precalculations *local_528;
  RTCFilterFunctionNArguments local_520;
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [8];
  undefined8 uStack_4c8;
  undefined1 local_4c0 [16];
  undefined8 local_4b0;
  undefined4 local_4a8;
  float local_4a4;
  undefined4 local_4a0;
  undefined4 local_49c;
  undefined4 local_498;
  uint local_494;
  uint local_490;
  undefined1 local_480 [16];
  long local_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined4 uStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined4 local_220;
  int local_21c;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  local_528 = pre;
  uVar66 = (ulong)(byte)prim[1];
  lVar62 = uVar66 * 0x25;
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 4 + 6)));
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 5 + 6)));
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 6 + 6)));
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0xf + 6)));
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x11 + 6)));
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x1a + 6)));
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x1b + 6)));
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x1c + 6)));
  fVar155 = *(float *)(prim + lVar62 + 0x12);
  auVar213._4_4_ = fVar155;
  auVar213._0_4_ = fVar155;
  auVar213._8_4_ = fVar155;
  auVar213._12_4_ = fVar155;
  auVar68 = vsubps_avx512vl((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                            *(undefined1 (*) [16])(prim + lVar62 + 6));
  fVar196 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar62 + 0x16)) *
            *(float *)(prim + lVar62 + 0x1a);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar66 * 7 + 6);
  auVar86 = vpmovsxwd_avx(auVar79);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar66 * 0xb + 6);
  auVar19 = vpmovsxwd_avx(auVar82);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar66 * 9 + 6);
  auVar139 = vpmovsxwd_avx(auVar81);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar66 * 0xd + 6);
  auVar149 = vpmovsxwd_avx(auVar80);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar66 * 0x12 + 6);
  auVar7 = vpmovsxwd_avx(auVar7);
  auVar68 = vmulps_avx512vl(auVar213,auVar68);
  auVar214._0_4_ = fVar155 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar214._4_4_ = fVar155 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar214._8_4_ = fVar155 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar214._12_4_ = fVar155 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar69 = vcvtdq2ps_avx512vl(auVar18);
  auVar70 = vcvtdq2ps_avx512vl(auVar75);
  auVar71 = vcvtdq2ps_avx512vl(auVar71);
  auVar72 = vcvtdq2ps_avx512vl(auVar72);
  auVar73 = vcvtdq2ps_avx512vl(auVar73);
  auVar79 = vcvtdq2ps_avx(auVar74);
  auVar82 = vcvtdq2ps_avx(auVar76);
  auVar81 = vcvtdq2ps_avx(auVar77);
  auVar80 = vcvtdq2ps_avx(auVar78);
  auVar194._4_4_ = auVar214._0_4_;
  auVar194._0_4_ = auVar214._0_4_;
  auVar194._8_4_ = auVar214._0_4_;
  auVar194._12_4_ = auVar214._0_4_;
  auVar18 = vshufps_avx(auVar214,auVar214,0x55);
  auVar75 = vshufps_avx(auVar214,auVar214,0xaa);
  auVar74 = vmulps_avx512vl(auVar75,auVar71);
  auVar148._0_4_ = auVar75._0_4_ * auVar79._0_4_;
  auVar148._4_4_ = auVar75._4_4_ * auVar79._4_4_;
  auVar148._8_4_ = auVar75._8_4_ * auVar79._8_4_;
  auVar148._12_4_ = auVar75._12_4_ * auVar79._12_4_;
  auVar138._0_4_ = auVar80._0_4_ * auVar75._0_4_;
  auVar138._4_4_ = auVar80._4_4_ * auVar75._4_4_;
  auVar138._8_4_ = auVar80._8_4_ * auVar75._8_4_;
  auVar138._12_4_ = auVar80._12_4_ * auVar75._12_4_;
  auVar75 = vfmadd231ps_avx512vl(auVar74,auVar18,auVar70);
  auVar74 = vfmadd231ps_avx512vl(auVar148,auVar18,auVar73);
  auVar18 = vfmadd231ps_fma(auVar138,auVar81,auVar18);
  auVar75 = vfmadd231ps_avx512vl(auVar75,auVar194,auVar69);
  auVar74 = vfmadd231ps_avx512vl(auVar74,auVar194,auVar72);
  auVar18 = vfmadd231ps_fma(auVar18,auVar82,auVar194);
  auVar76 = vbroadcastss_avx512vl(auVar68);
  auVar77 = vshufps_avx512vl(auVar68,auVar68,0x55);
  auVar78 = vshufps_avx512vl(auVar68,auVar68,0xaa);
  auVar71 = vmulps_avx512vl(auVar78,auVar71);
  auVar79 = vmulps_avx512vl(auVar78,auVar79);
  auVar80 = vmulps_avx512vl(auVar78,auVar80);
  auVar71 = vfmadd231ps_avx512vl(auVar71,auVar77,auVar70);
  auVar79 = vfmadd231ps_avx512vl(auVar79,auVar77,auVar73);
  auVar81 = vfmadd231ps_avx512vl(auVar80,auVar77,auVar81);
  auVar69 = vfmadd231ps_avx512vl(auVar71,auVar76,auVar69);
  auVar70 = vfmadd231ps_avx512vl(auVar79,auVar76,auVar72);
  auVar68 = vfmadd231ps_fma(auVar81,auVar76,auVar82);
  auVar79 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar219 = ZEXT1664(auVar79);
  auVar82 = vandps_avx512vl(auVar75,auVar79);
  auVar210._8_4_ = 0x219392ef;
  auVar210._0_8_ = 0x219392ef219392ef;
  auVar210._12_4_ = 0x219392ef;
  uVar56 = vcmpps_avx512vl(auVar82,auVar210,1);
  bVar12 = (bool)((byte)uVar56 & 1);
  auVar83._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar75._0_4_;
  bVar12 = (bool)((byte)(uVar56 >> 1) & 1);
  auVar83._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar75._4_4_;
  bVar12 = (bool)((byte)(uVar56 >> 2) & 1);
  auVar83._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar75._8_4_;
  bVar12 = (bool)((byte)(uVar56 >> 3) & 1);
  auVar83._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar75._12_4_;
  auVar82 = vandps_avx512vl(auVar74,auVar79);
  uVar56 = vcmpps_avx512vl(auVar82,auVar210,1);
  bVar12 = (bool)((byte)uVar56 & 1);
  auVar84._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar74._0_4_;
  bVar12 = (bool)((byte)(uVar56 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar74._4_4_;
  bVar12 = (bool)((byte)(uVar56 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar74._8_4_;
  bVar12 = (bool)((byte)(uVar56 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar74._12_4_;
  auVar79 = vandps_avx512vl(auVar18,auVar79);
  uVar56 = vcmpps_avx512vl(auVar79,auVar210,1);
  bVar12 = (bool)((byte)uVar56 & 1);
  auVar85._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar18._0_4_;
  bVar12 = (bool)((byte)(uVar56 >> 1) & 1);
  auVar85._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar18._4_4_;
  bVar12 = (bool)((byte)(uVar56 >> 2) & 1);
  auVar85._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar18._8_4_;
  bVar12 = (bool)((byte)(uVar56 >> 3) & 1);
  auVar85._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar18._12_4_;
  auVar208._8_4_ = 0x3f800000;
  auVar208._0_8_ = 0x3f8000003f800000;
  auVar208._12_4_ = 0x3f800000;
  auVar82 = vrcp14ps_avx512vl(auVar83);
  auVar79 = vfnmadd213ps_fma(auVar83,auVar82,auVar208);
  auVar81 = vfmadd132ps_fma(auVar79,auVar82,auVar82);
  auVar82 = vrcp14ps_avx512vl(auVar84);
  auVar79 = vfnmadd213ps_fma(auVar84,auVar82,auVar208);
  auVar80 = vfmadd132ps_fma(auVar79,auVar82,auVar82);
  auVar82 = vrcp14ps_avx512vl(auVar85);
  auVar79 = vfnmadd213ps_fma(auVar85,auVar82,auVar208);
  auVar77 = vfmadd132ps_fma(auVar79,auVar82,auVar82);
  auVar177._4_4_ = fVar196;
  auVar177._0_4_ = fVar196;
  auVar177._8_4_ = fVar196;
  auVar177._12_4_ = fVar196;
  auVar79 = vcvtdq2ps_avx(auVar86);
  auVar82 = vcvtdq2ps_avx(auVar19);
  auVar82 = vsubps_avx(auVar82,auVar79);
  auVar78 = vfmadd213ps_fma(auVar82,auVar177,auVar79);
  auVar79 = vcvtdq2ps_avx(auVar139);
  auVar82 = vcvtdq2ps_avx(auVar149);
  auVar82 = vsubps_avx(auVar82,auVar79);
  auVar86 = vfmadd213ps_fma(auVar82,auVar177,auVar79);
  auVar79 = vcvtdq2ps_avx(auVar7);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar66 * 0x16 + 6);
  auVar82 = vpmovsxwd_avx(auVar18);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,auVar79);
  auVar7 = vfmadd213ps_fma(auVar82,auVar177,auVar79);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar66 * 0x14 + 6);
  auVar79 = vpmovsxwd_avx(auVar75);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar66 * 0x18 + 6);
  auVar82 = vpmovsxwd_avx(auVar71);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,auVar79);
  auVar18 = vfmadd213ps_fma(auVar82,auVar177,auVar79);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar66 * 0x1d + 6);
  auVar79 = vpmovsxwd_avx(auVar72);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar66 * 0x21 + 6);
  auVar82 = vpmovsxwd_avx(auVar73);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,auVar79);
  auVar75 = vfmadd213ps_fma(auVar82,auVar177,auVar79);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar66 * 0x1f + 6);
  auVar79 = vpmovsxwd_avx(auVar74);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar66 * 0x23 + 6);
  auVar82 = vpmovsxwd_avx(auVar76);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,auVar79);
  auVar82 = vfmadd213ps_fma(auVar82,auVar177,auVar79);
  auVar79 = vsubps_avx(auVar78,auVar69);
  auVar178._0_4_ = auVar81._0_4_ * auVar79._0_4_;
  auVar178._4_4_ = auVar81._4_4_ * auVar79._4_4_;
  auVar178._8_4_ = auVar81._8_4_ * auVar79._8_4_;
  auVar178._12_4_ = auVar81._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar86,auVar69);
  auVar69._0_4_ = auVar81._0_4_ * auVar79._0_4_;
  auVar69._4_4_ = auVar81._4_4_ * auVar79._4_4_;
  auVar69._8_4_ = auVar81._8_4_ * auVar79._8_4_;
  auVar69._12_4_ = auVar81._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar7,auVar70);
  auVar184._0_4_ = auVar80._0_4_ * auVar79._0_4_;
  auVar184._4_4_ = auVar80._4_4_ * auVar79._4_4_;
  auVar184._8_4_ = auVar80._8_4_ * auVar79._8_4_;
  auVar184._12_4_ = auVar80._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar18,auVar70);
  auVar149._0_4_ = auVar80._0_4_ * auVar79._0_4_;
  auVar149._4_4_ = auVar80._4_4_ * auVar79._4_4_;
  auVar149._8_4_ = auVar80._8_4_ * auVar79._8_4_;
  auVar149._12_4_ = auVar80._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar75,auVar68);
  auVar70._0_4_ = auVar77._0_4_ * auVar79._0_4_;
  auVar70._4_4_ = auVar77._4_4_ * auVar79._4_4_;
  auVar70._8_4_ = auVar77._8_4_ * auVar79._8_4_;
  auVar70._12_4_ = auVar77._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar82,auVar68);
  auVar139._0_4_ = auVar77._0_4_ * auVar79._0_4_;
  auVar139._4_4_ = auVar77._4_4_ * auVar79._4_4_;
  auVar139._8_4_ = auVar77._8_4_ * auVar79._8_4_;
  auVar139._12_4_ = auVar77._12_4_ * auVar79._12_4_;
  auVar79 = vpminsd_avx(auVar178,auVar69);
  auVar82 = vpminsd_avx(auVar184,auVar149);
  auVar79 = vmaxps_avx(auVar79,auVar82);
  auVar82 = vpminsd_avx(auVar70,auVar139);
  uVar137 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar77._4_4_ = uVar137;
  auVar77._0_4_ = uVar137;
  auVar77._8_4_ = uVar137;
  auVar77._12_4_ = uVar137;
  auVar82 = vmaxps_avx512vl(auVar82,auVar77);
  auVar79 = vmaxps_avx(auVar79,auVar82);
  auVar78._8_4_ = 0x3f7ffffa;
  auVar78._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar78._12_4_ = 0x3f7ffffa;
  local_480 = vmulps_avx512vl(auVar79,auVar78);
  auVar220 = ZEXT1664(local_480);
  auVar79 = vpmaxsd_avx(auVar178,auVar69);
  auVar82 = vpmaxsd_avx(auVar184,auVar149);
  auVar79 = vminps_avx(auVar79,auVar82);
  auVar82 = vpmaxsd_avx(auVar70,auVar139);
  fVar155 = (ray->super_RayK<1>).tfar;
  auVar86._4_4_ = fVar155;
  auVar86._0_4_ = fVar155;
  auVar86._8_4_ = fVar155;
  auVar86._12_4_ = fVar155;
  auVar82 = vminps_avx512vl(auVar82,auVar86);
  auVar79 = vminps_avx(auVar79,auVar82);
  auVar19._8_4_ = 0x3f800003;
  auVar19._0_8_ = 0x3f8000033f800003;
  auVar19._12_4_ = 0x3f800003;
  auVar79 = vmulps_avx512vl(auVar79,auVar19);
  auVar82 = vpbroadcastd_avx512vl();
  uVar147 = vcmpps_avx512vl(local_480,auVar79,2);
  uVar21 = vpcmpgtd_avx512vl(auVar82,_DAT_01f4ad30);
  local_548 = (ulong)((byte)uVar147 & 0xf & (byte)uVar21);
  auVar79 = vbroadcastss_avx512vl(ZEXT416(0xbeaaaaab));
  auVar221 = ZEXT1664(auVar79);
  local_530 = prim;
  local_540 = context;
  do {
    auVar99 = local_400;
    if (local_548 == 0) {
      return;
    }
    lVar62 = 0;
    for (uVar56 = local_548; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
      lVar62 = lVar62 + 1;
    }
    uVar65 = *(uint *)(prim + 2);
    uVar58 = *(uint *)(prim + lVar62 * 4 + 6);
    local_550 = (ulong)uVar65;
    pGVar60 = (context->scene->geometries).items[uVar65].ptr;
    local_538 = (ulong)uVar58;
    uVar56 = (ulong)*(uint *)(*(long *)&pGVar60->field_0x58 +
                             (ulong)uVar58 *
                             pGVar60[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i);
    fVar155 = (pGVar60->time_range).lower;
    fVar155 = pGVar60->fnumTimeSegments *
              (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar155) /
              ((pGVar60->time_range).upper - fVar155));
    auVar79 = vroundss_avx(ZEXT416((uint)fVar155),ZEXT416((uint)fVar155),9);
    auVar79 = vminss_avx(auVar79,ZEXT416((uint)(pGVar60->fnumTimeSegments + -1.0)));
    auVar79 = vmaxss_avx(ZEXT816(0) << 0x20,auVar79);
    fVar155 = fVar155 - auVar79._0_4_;
    fVar196 = 1.0 - fVar155;
    _Var9 = pGVar60[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar61 = (long)(int)auVar79._0_4_ * 0x38;
    lVar63 = *(long *)(_Var9 + 0x10 + lVar61);
    lVar59 = *(long *)(_Var9 + 0x38 + lVar61);
    lVar10 = *(long *)(_Var9 + 0x48 + lVar61);
    pfVar3 = (float *)(lVar59 + lVar10 * uVar56);
    auVar209._0_4_ = fVar155 * *pfVar3;
    auVar209._4_4_ = fVar155 * pfVar3[1];
    auVar209._8_4_ = fVar155 * pfVar3[2];
    auVar209._12_4_ = fVar155 * pfVar3[3];
    lVar62 = uVar56 + 1;
    pfVar3 = (float *)(lVar59 + lVar10 * lVar62);
    auVar212._0_4_ = fVar155 * *pfVar3;
    auVar212._4_4_ = fVar155 * pfVar3[1];
    auVar212._8_4_ = fVar155 * pfVar3[2];
    auVar212._12_4_ = fVar155 * pfVar3[3];
    p_Var11 = pGVar60[4].occlusionFilterN;
    auVar68._4_4_ = fVar196;
    auVar68._0_4_ = fVar196;
    auVar68._8_4_ = fVar196;
    auVar68._12_4_ = fVar196;
    local_4c0 = vfmadd231ps_fma(auVar209,auVar68,
                                *(undefined1 (*) [16])(*(long *)(_Var9 + lVar61) + lVar63 * uVar56))
    ;
    _local_4d0 = vfmadd231ps_fma(auVar212,auVar68,
                                 *(undefined1 (*) [16])(*(long *)(_Var9 + lVar61) + lVar63 * lVar62)
                                );
    pfVar3 = (float *)(*(long *)(p_Var11 + lVar61 + 0x38) +
                      uVar56 * *(long *)(p_Var11 + lVar61 + 0x48));
    auVar211._0_4_ = fVar155 * *pfVar3;
    auVar211._4_4_ = fVar155 * pfVar3[1];
    auVar211._8_4_ = fVar155 * pfVar3[2];
    auVar211._12_4_ = fVar155 * pfVar3[3];
    pfVar3 = (float *)(*(long *)(p_Var11 + lVar61 + 0x38) +
                      *(long *)(p_Var11 + lVar61 + 0x48) * lVar62);
    auVar191._0_4_ = fVar155 * *pfVar3;
    auVar191._4_4_ = fVar155 * pfVar3[1];
    auVar191._8_4_ = fVar155 * pfVar3[2];
    auVar191._12_4_ = fVar155 * pfVar3[3];
    auVar79 = vfmadd231ps_fma(auVar211,auVar68,
                              *(undefined1 (*) [16])
                               (*(long *)(p_Var11 + lVar61) +
                               *(long *)(p_Var11 + lVar61 + 0x10) * uVar56));
    auVar82 = vfmadd231ps_fma(auVar191,auVar68,
                              *(undefined1 (*) [16])
                               (*(long *)(p_Var11 + lVar61) +
                               *(long *)(p_Var11 + lVar61 + 0x10) * lVar62));
    iVar8 = (int)pGVar60[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar86 = auVar221._0_16_;
    local_4e0 = vfnmadd213ps_avx512vl(auVar79,auVar86,local_4c0);
    local_4f0 = vfmadd213ps_avx512vl(auVar82,auVar86,_local_4d0);
    aVar4 = (ray->super_RayK<1>).org.field_0;
    auVar82 = vsubps_avx(local_4c0,(undefined1  [16])aVar4);
    uVar137 = auVar82._0_4_;
    auVar150._4_4_ = uVar137;
    auVar150._0_4_ = uVar137;
    auVar150._8_4_ = uVar137;
    auVar150._12_4_ = uVar137;
    auVar79 = vshufps_avx(auVar82,auVar82,0x55);
    aVar5 = (local_528->ray_space).vx.field_0;
    aVar6 = (local_528->ray_space).vy.field_0;
    fVar155 = (local_528->ray_space).vz.field_0.m128[0];
    fVar196 = (local_528->ray_space).vz.field_0.m128[1];
    fVar197 = (local_528->ray_space).vz.field_0.m128[2];
    fVar198 = (local_528->ray_space).vz.field_0.m128[3];
    auVar82 = vshufps_avx(auVar82,auVar82,0xaa);
    auVar195._0_4_ = auVar82._0_4_ * fVar155;
    auVar195._4_4_ = auVar82._4_4_ * fVar196;
    auVar195._8_4_ = auVar82._8_4_ * fVar197;
    auVar195._12_4_ = auVar82._12_4_ * fVar198;
    auVar79 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar6,auVar79);
    auVar81 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar5,auVar150);
    auVar82 = vsubps_avx(local_4e0,(undefined1  [16])aVar4);
    uVar137 = auVar82._0_4_;
    auVar151._4_4_ = uVar137;
    auVar151._0_4_ = uVar137;
    auVar151._8_4_ = uVar137;
    auVar151._12_4_ = uVar137;
    auVar79 = vshufps_avx(auVar82,auVar82,0x55);
    auVar82 = vshufps_avx(auVar82,auVar82,0xaa);
    auVar200._0_4_ = auVar82._0_4_ * fVar155;
    auVar200._4_4_ = auVar82._4_4_ * fVar196;
    auVar200._8_4_ = auVar82._8_4_ * fVar197;
    auVar200._12_4_ = auVar82._12_4_ * fVar198;
    auVar79 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar6,auVar79);
    auVar80 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar5,auVar151);
    auVar82 = vsubps_avx(local_4f0,(undefined1  [16])aVar4);
    uVar137 = auVar82._0_4_;
    auVar152._4_4_ = uVar137;
    auVar152._0_4_ = uVar137;
    auVar152._8_4_ = uVar137;
    auVar152._12_4_ = uVar137;
    auVar79 = vshufps_avx(auVar82,auVar82,0x55);
    auVar82 = vshufps_avx(auVar82,auVar82,0xaa);
    auVar203._0_4_ = fVar155 * auVar82._0_4_;
    auVar203._4_4_ = fVar196 * auVar82._4_4_;
    auVar203._8_4_ = fVar197 * auVar82._8_4_;
    auVar203._12_4_ = fVar198 * auVar82._12_4_;
    auVar79 = vfmadd231ps_fma(auVar203,(undefined1  [16])aVar6,auVar79);
    auVar7 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar5,auVar152);
    local_3a0 = ZEXT1632((undefined1  [16])aVar4);
    auVar82 = vsubps_avx(_local_4d0,(undefined1  [16])aVar4);
    uVar137 = auVar82._0_4_;
    auVar153._4_4_ = uVar137;
    auVar153._0_4_ = uVar137;
    auVar153._8_4_ = uVar137;
    auVar153._12_4_ = uVar137;
    auVar79 = vshufps_avx(auVar82,auVar82,0x55);
    auVar82 = vshufps_avx(auVar82,auVar82,0xaa);
    auVar204._0_4_ = auVar82._0_4_ * fVar155;
    auVar204._4_4_ = auVar82._4_4_ * fVar196;
    auVar204._8_4_ = auVar82._8_4_ * fVar197;
    auVar204._12_4_ = auVar82._12_4_ * fVar198;
    auVar79 = vfmadd231ps_fma(auVar204,(undefined1  [16])aVar6,auVar79);
    auVar18 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar5,auVar153);
    lVar62 = (long)iVar8;
    lVar63 = lVar62 * 0x44;
    auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar63);
    uVar137 = auVar81._0_4_;
    local_2a0._4_4_ = uVar137;
    local_2a0._0_4_ = uVar137;
    local_2a0._8_4_ = uVar137;
    local_2a0._12_4_ = uVar137;
    local_2a0._16_4_ = uVar137;
    local_2a0._20_4_ = uVar137;
    local_2a0._24_4_ = uVar137;
    local_2a0._28_4_ = uVar137;
    auVar87._8_4_ = 1;
    auVar87._0_8_ = 0x100000001;
    auVar87._12_4_ = 1;
    auVar87._16_4_ = 1;
    auVar87._20_4_ = 1;
    auVar87._24_4_ = 1;
    auVar87._28_4_ = 1;
    local_2c0 = vpermps_avx2(auVar87,ZEXT1632(auVar81));
    auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar63 + 0x484);
    uVar137 = auVar80._0_4_;
    local_2e0._4_4_ = uVar137;
    local_2e0._0_4_ = uVar137;
    local_2e0._8_4_ = uVar137;
    local_2e0._12_4_ = uVar137;
    local_2e0._16_4_ = uVar137;
    local_2e0._20_4_ = uVar137;
    local_2e0._24_4_ = uVar137;
    local_2e0._28_4_ = uVar137;
    auVar102 = *(undefined1 (*) [32])(bezier_basis0 + lVar63 + 0x908);
    local_300 = vpermps_avx512vl(auVar87,ZEXT1632(auVar80));
    local_320 = vbroadcastss_avx512vl(auVar7);
    local_340 = vpermps_avx512vl(auVar87,ZEXT1632(auVar7));
    auVar101 = *(undefined1 (*) [32])(bezier_basis0 + lVar63 + 0xd8c);
    fVar196 = auVar18._0_4_;
    local_360._4_4_ = fVar196;
    local_360._0_4_ = fVar196;
    fStack_358 = fVar196;
    fStack_354 = fVar196;
    fStack_350 = fVar196;
    fStack_34c = fVar196;
    fStack_348 = fVar196;
    register0x000013dc = fVar196;
    _local_380 = vpermps_avx512vl(auVar87,ZEXT1632(auVar18));
    auVar87 = vmulps_avx512vl(_local_360,auVar101);
    auVar88 = vmulps_avx512vl(_local_380,auVar101);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar102,local_320);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar102,local_340);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar104,local_2e0);
    auVar89 = vfmadd231ps_avx512vl(auVar88,auVar104,local_300);
    auVar90 = vfmadd231ps_avx512vl(auVar87,auVar103,local_2a0);
    auVar189 = ZEXT3264(auVar90);
    auVar87 = *(undefined1 (*) [32])(bezier_basis1 + lVar63);
    auVar88 = *(undefined1 (*) [32])(bezier_basis1 + lVar63 + 0x484);
    auVar91 = vfmadd231ps_avx512vl(auVar89,auVar103,local_2c0);
    auVar183 = ZEXT3264(auVar91);
    auVar89 = *(undefined1 (*) [32])(bezier_basis1 + lVar63 + 0x908);
    auVar100 = *(undefined1 (*) [32])(bezier_basis1 + lVar63 + 0xd8c);
    auVar92 = vmulps_avx512vl(_local_360,auVar100);
    auVar93 = vmulps_avx512vl(_local_380,auVar100);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar89,local_320);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar89,local_340);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar88,local_2e0);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar88,local_300);
    auVar75 = vfmadd231ps_fma(auVar92,auVar87,local_2a0);
    auVar192 = ZEXT1664(auVar75);
    auVar92 = vfmadd231ps_avx512vl(auVar93,auVar87,local_2c0);
    auVar93 = vsubps_avx512vl(ZEXT1632(auVar75),auVar90);
    auVar94 = vsubps_avx512vl(auVar92,auVar91);
    auVar95 = vmulps_avx512vl(auVar91,auVar93);
    auVar96 = vmulps_avx512vl(auVar90,auVar94);
    auVar95 = vsubps_avx512vl(auVar95,auVar96);
    auVar79 = vshufps_avx(local_4c0,local_4c0,0xff);
    uVar147 = auVar79._0_8_;
    local_80._8_8_ = uVar147;
    local_80._0_8_ = uVar147;
    local_80._16_8_ = uVar147;
    local_80._24_8_ = uVar147;
    auVar79 = vshufps_avx(local_4e0,local_4e0,0xff);
    local_a0 = vbroadcastsd_avx512vl(auVar79);
    auVar79 = vshufps_avx(local_4f0,local_4f0,0xff);
    local_c0 = vbroadcastsd_avx512vl(auVar79);
    auVar79 = vshufps_avx(_local_4d0,_local_4d0,0xff);
    uVar147 = auVar79._0_8_;
    local_e0._8_8_ = uVar147;
    local_e0._0_8_ = uVar147;
    local_e0._16_8_ = uVar147;
    local_e0._24_8_ = uVar147;
    auVar96 = vmulps_avx512vl(local_e0,auVar101);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar102,local_c0);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar104,local_a0);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar103,local_80);
    auVar97 = vmulps_avx512vl(local_e0,auVar100);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar89,local_c0);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar88,local_a0);
    auVar71 = vfmadd231ps_fma(auVar97,auVar87,local_80);
    auVar97 = vmulps_avx512vl(auVar94,auVar94);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar93,auVar93);
    auVar98 = vmaxps_avx512vl(auVar96,ZEXT1632(auVar71));
    auVar98 = vmulps_avx512vl(auVar98,auVar98);
    auVar97 = vmulps_avx512vl(auVar98,auVar97);
    auVar95 = vmulps_avx512vl(auVar95,auVar95);
    uVar147 = vcmpps_avx512vl(auVar95,auVar97,2);
    auVar76 = local_4c0;
    auVar79 = vblendps_avx(auVar81,local_4c0,8);
    auVar78 = auVar219._0_16_;
    auVar82 = vandps_avx512vl(auVar79,auVar78);
    auVar73 = local_4e0;
    auVar79 = vblendps_avx(auVar80,local_4e0,8);
    auVar79 = vandps_avx512vl(auVar79,auVar78);
    auVar82 = vmaxps_avx(auVar82,auVar79);
    auVar72 = local_4f0;
    auVar79 = vblendps_avx(auVar7,local_4f0,8);
    auVar77 = vandps_avx512vl(auVar79,auVar78);
    auVar74 = _local_4d0;
    auVar79 = vblendps_avx(auVar18,_local_4d0,8);
    auVar79 = vandps_avx512vl(auVar79,auVar78);
    auVar79 = vmaxps_avx(auVar77,auVar79);
    auVar79 = vmaxps_avx(auVar82,auVar79);
    auVar82 = vmovshdup_avx(auVar79);
    auVar82 = vmaxss_avx(auVar82,auVar79);
    auVar79 = vshufpd_avx(auVar79,auVar79,1);
    auVar79 = vmaxss_avx(auVar79,auVar82);
    local_400._0_4_ = (undefined4)iVar8;
    local_400._4_12_ = local_4f0._4_12_;
    local_400._16_16_ = auVar99._16_16_;
    auVar99._4_4_ = local_400._0_4_;
    auVar99._0_4_ = local_400._0_4_;
    auVar99._8_4_ = local_400._0_4_;
    auVar99._12_4_ = local_400._0_4_;
    auVar99._16_4_ = local_400._0_4_;
    auVar99._20_4_ = local_400._0_4_;
    auVar99._24_4_ = local_400._0_4_;
    auVar99._28_4_ = local_400._0_4_;
    uVar21 = vcmpps_avx512vl(auVar99,_DAT_01f7b060,0xe);
    bVar64 = (byte)uVar147 & (byte)uVar21;
    fVar155 = auVar79._0_4_ * 4.7683716e-07;
    local_3e0._0_16_ = ZEXT416((uint)fVar155);
    auVar97._8_4_ = 2;
    auVar97._0_8_ = 0x200000002;
    auVar97._12_4_ = 2;
    auVar97._16_4_ = 2;
    auVar97._20_4_ = 2;
    auVar97._24_4_ = 2;
    auVar97._28_4_ = 2;
    auVar99 = vpermps_avx512vl(auVar97,ZEXT1632(auVar81));
    auVar218 = ZEXT3264(auVar99);
    auVar95 = vpermps_avx512vl(auVar97,ZEXT1632(auVar80));
    local_140 = vpermps_avx2(auVar97,ZEXT1632(auVar7));
    local_160 = vpermps_avx2(auVar97,ZEXT1632(auVar18));
    local_4f0 = auVar72;
    local_4e0 = auVar73;
    _local_4d0 = auVar74;
    local_4c0 = auVar76;
    if (bVar64 != 0) {
      auVar100 = vmulps_avx512vl(local_160,auVar100);
      auVar89 = vfmadd213ps_avx512vl(auVar89,local_140,auVar100);
      auVar88 = vfmadd213ps_avx512vl(auVar88,auVar95,auVar89);
      auVar97 = vfmadd213ps_avx512vl(auVar87,auVar99,auVar88);
      auVar101 = vmulps_avx512vl(local_160,auVar101);
      auVar102 = vfmadd213ps_avx512vl(auVar102,local_140,auVar101);
      auVar88 = vfmadd213ps_avx512vl(auVar104,auVar95,auVar102);
      auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar63 + 0x1210);
      auVar102 = *(undefined1 (*) [32])(bezier_basis0 + lVar63 + 0x1694);
      auVar101 = *(undefined1 (*) [32])(bezier_basis0 + lVar63 + 0x1b18);
      auVar87 = *(undefined1 (*) [32])(bezier_basis0 + lVar63 + 0x1f9c);
      auVar98 = vfmadd213ps_avx512vl(auVar103,auVar99,auVar88);
      auVar201._0_4_ = fVar196 * auVar87._0_4_;
      auVar201._4_4_ = fVar196 * auVar87._4_4_;
      auVar201._8_4_ = fVar196 * auVar87._8_4_;
      auVar201._12_4_ = fVar196 * auVar87._12_4_;
      auVar201._16_4_ = fVar196 * auVar87._16_4_;
      auVar201._20_4_ = fVar196 * auVar87._20_4_;
      auVar201._24_4_ = fVar196 * auVar87._24_4_;
      auVar201._28_4_ = 0;
      auVar103 = vmulps_avx512vl(_local_380,auVar87);
      auVar87 = vmulps_avx512vl(local_160,auVar87);
      auVar88 = vfmadd231ps_avx512vl(auVar201,auVar101,local_320);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar101,local_340);
      auVar101 = vfmadd231ps_avx512vl(auVar87,local_140,auVar101);
      auVar87 = vfmadd231ps_avx512vl(auVar88,auVar102,local_2e0);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar102,local_300);
      auVar88 = vfmadd231ps_avx512vl(auVar101,auVar95,auVar102);
      auVar79 = vfmadd231ps_fma(auVar87,auVar104,local_2a0);
      auVar82 = vfmadd231ps_fma(auVar103,auVar104,local_2c0);
      auVar103 = *(undefined1 (*) [32])(bezier_basis1 + lVar63 + 0x1210);
      auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar63 + 0x1b18);
      auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar63 + 0x1f9c);
      auVar87 = vfmadd231ps_avx512vl(auVar88,auVar99,auVar104);
      auVar88._4_4_ = fVar196 * auVar101._4_4_;
      auVar88._0_4_ = fVar196 * auVar101._0_4_;
      auVar88._8_4_ = fVar196 * auVar101._8_4_;
      auVar88._12_4_ = fVar196 * auVar101._12_4_;
      auVar88._16_4_ = fVar196 * auVar101._16_4_;
      auVar88._20_4_ = fVar196 * auVar101._20_4_;
      auVar88._24_4_ = fVar196 * auVar101._24_4_;
      auVar88._28_4_ = auVar104._28_4_;
      auVar104 = vmulps_avx512vl(_local_380,auVar101);
      auVar217 = ZEXT3264(auVar95);
      auVar101 = vmulps_avx512vl(local_160,auVar101);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar102,local_320);
      auVar89 = vfmadd231ps_avx512vl(auVar104,auVar102,local_340);
      auVar102 = vfmadd231ps_avx512vl(auVar101,local_140,auVar102);
      auVar220 = ZEXT1664(auVar220._0_16_);
      auVar221 = ZEXT1664(auVar86);
      auVar219 = ZEXT1664(auVar78);
      auVar104 = *(undefined1 (*) [32])(bezier_basis1 + lVar63 + 0x1694);
      auVar101 = vfmadd231ps_avx512vl(auVar88,auVar104,local_2e0);
      auVar88 = vfmadd231ps_avx512vl(auVar89,auVar104,local_300);
      auVar104 = vfmadd231ps_avx512vl(auVar102,auVar95,auVar104);
      auVar81 = vfmadd231ps_fma(auVar101,auVar103,local_2a0);
      auVar80 = vfmadd231ps_fma(auVar88,auVar103,local_2c0);
      auVar102 = vfmadd231ps_avx512vl(auVar104,auVar99,auVar103);
      auVar215._8_4_ = 0x7fffffff;
      auVar215._0_8_ = 0x7fffffff7fffffff;
      auVar215._12_4_ = 0x7fffffff;
      auVar215._16_4_ = 0x7fffffff;
      auVar215._20_4_ = 0x7fffffff;
      auVar215._24_4_ = 0x7fffffff;
      auVar215._28_4_ = 0x7fffffff;
      auVar103 = vandps_avx(ZEXT1632(auVar79),auVar215);
      auVar104 = vandps_avx(ZEXT1632(auVar82),auVar215);
      auVar104 = vmaxps_avx(auVar103,auVar104);
      auVar103 = vandps_avx(auVar87,auVar215);
      auVar103 = vmaxps_avx(auVar104,auVar103);
      auVar205._4_4_ = fVar155;
      auVar205._0_4_ = fVar155;
      auVar205._8_4_ = fVar155;
      auVar205._12_4_ = fVar155;
      auVar205._16_4_ = fVar155;
      auVar205._20_4_ = fVar155;
      auVar205._24_4_ = fVar155;
      auVar205._28_4_ = fVar155;
      uVar56 = vcmpps_avx512vl(auVar103,auVar205,1);
      bVar12 = (bool)((byte)uVar56 & 1);
      auVar105._0_4_ = (float)((uint)bVar12 * auVar93._0_4_ | (uint)!bVar12 * auVar79._0_4_);
      bVar12 = (bool)((byte)(uVar56 >> 1) & 1);
      auVar105._4_4_ = (float)((uint)bVar12 * auVar93._4_4_ | (uint)!bVar12 * auVar79._4_4_);
      bVar12 = (bool)((byte)(uVar56 >> 2) & 1);
      auVar105._8_4_ = (float)((uint)bVar12 * auVar93._8_4_ | (uint)!bVar12 * auVar79._8_4_);
      bVar12 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar105._12_4_ = (float)((uint)bVar12 * auVar93._12_4_ | (uint)!bVar12 * auVar79._12_4_);
      fVar197 = (float)((uint)((byte)(uVar56 >> 4) & 1) * auVar93._16_4_);
      auVar105._16_4_ = fVar197;
      fVar155 = (float)((uint)((byte)(uVar56 >> 5) & 1) * auVar93._20_4_);
      auVar105._20_4_ = fVar155;
      fVar196 = (float)((uint)((byte)(uVar56 >> 6) & 1) * auVar93._24_4_);
      auVar105._24_4_ = fVar196;
      uVar57 = (uint)(byte)(uVar56 >> 7) * auVar93._28_4_;
      auVar105._28_4_ = uVar57;
      bVar12 = (bool)((byte)uVar56 & 1);
      auVar106._0_4_ = (float)((uint)bVar12 * auVar94._0_4_ | (uint)!bVar12 * auVar82._0_4_);
      bVar12 = (bool)((byte)(uVar56 >> 1) & 1);
      auVar106._4_4_ = (float)((uint)bVar12 * auVar94._4_4_ | (uint)!bVar12 * auVar82._4_4_);
      bVar12 = (bool)((byte)(uVar56 >> 2) & 1);
      auVar106._8_4_ = (float)((uint)bVar12 * auVar94._8_4_ | (uint)!bVar12 * auVar82._8_4_);
      bVar12 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar106._12_4_ = (float)((uint)bVar12 * auVar94._12_4_ | (uint)!bVar12 * auVar82._12_4_);
      fVar198 = (float)((uint)((byte)(uVar56 >> 4) & 1) * auVar94._16_4_);
      auVar106._16_4_ = fVar198;
      fVar199 = (float)((uint)((byte)(uVar56 >> 5) & 1) * auVar94._20_4_);
      auVar106._20_4_ = fVar199;
      fVar166 = (float)((uint)((byte)(uVar56 >> 6) & 1) * auVar94._24_4_);
      auVar106._24_4_ = fVar166;
      auVar106._28_4_ = (uint)(byte)(uVar56 >> 7) * auVar94._28_4_;
      auVar103 = vandps_avx(auVar215,ZEXT1632(auVar81));
      auVar104 = vandps_avx(ZEXT1632(auVar80),auVar215);
      auVar104 = vmaxps_avx(auVar103,auVar104);
      auVar103 = vandps_avx(auVar102,auVar215);
      auVar103 = vmaxps_avx(auVar104,auVar103);
      uVar56 = vcmpps_avx512vl(auVar103,auVar205,1);
      bVar12 = (bool)((byte)uVar56 & 1);
      auVar107._0_4_ = (float)((uint)bVar12 * auVar93._0_4_ | (uint)!bVar12 * auVar81._0_4_);
      bVar12 = (bool)((byte)(uVar56 >> 1) & 1);
      auVar107._4_4_ = (float)((uint)bVar12 * auVar93._4_4_ | (uint)!bVar12 * auVar81._4_4_);
      bVar12 = (bool)((byte)(uVar56 >> 2) & 1);
      auVar107._8_4_ = (float)((uint)bVar12 * auVar93._8_4_ | (uint)!bVar12 * auVar81._8_4_);
      bVar12 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar107._12_4_ = (float)((uint)bVar12 * auVar93._12_4_ | (uint)!bVar12 * auVar81._12_4_);
      fVar167 = (float)((uint)((byte)(uVar56 >> 4) & 1) * auVar93._16_4_);
      auVar107._16_4_ = fVar167;
      fVar168 = (float)((uint)((byte)(uVar56 >> 5) & 1) * auVar93._20_4_);
      auVar107._20_4_ = fVar168;
      fVar169 = (float)((uint)((byte)(uVar56 >> 6) & 1) * auVar93._24_4_);
      auVar107._24_4_ = fVar169;
      auVar107._28_4_ = (uint)(byte)(uVar56 >> 7) * auVar93._28_4_;
      bVar12 = (bool)((byte)uVar56 & 1);
      auVar108._0_4_ = (float)((uint)bVar12 * auVar94._0_4_ | (uint)!bVar12 * auVar80._0_4_);
      bVar12 = (bool)((byte)(uVar56 >> 1) & 1);
      auVar108._4_4_ = (float)((uint)bVar12 * auVar94._4_4_ | (uint)!bVar12 * auVar80._4_4_);
      bVar12 = (bool)((byte)(uVar56 >> 2) & 1);
      auVar108._8_4_ = (float)((uint)bVar12 * auVar94._8_4_ | (uint)!bVar12 * auVar80._8_4_);
      bVar12 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar108._12_4_ = (float)((uint)bVar12 * auVar94._12_4_ | (uint)!bVar12 * auVar80._12_4_);
      fVar130 = (float)((uint)((byte)(uVar56 >> 4) & 1) * auVar94._16_4_);
      auVar108._16_4_ = fVar130;
      fVar67 = (float)((uint)((byte)(uVar56 >> 5) & 1) * auVar94._20_4_);
      auVar108._20_4_ = fVar67;
      fVar131 = (float)((uint)((byte)(uVar56 >> 6) & 1) * auVar94._24_4_);
      auVar108._24_4_ = fVar131;
      auVar108._28_4_ = (uint)(byte)(uVar56 >> 7) * auVar94._28_4_;
      auVar86 = vxorps_avx512vl(local_300._0_16_,local_300._0_16_);
      auVar103 = vfmadd213ps_avx512vl(auVar105,auVar105,ZEXT1632(auVar86));
      auVar79 = vfmadd231ps_fma(auVar103,auVar106,auVar106);
      auVar102 = vrsqrt14ps_avx512vl(ZEXT1632(auVar79));
      fVar134 = auVar102._0_4_;
      fVar132 = auVar102._4_4_;
      fVar133 = auVar102._8_4_;
      fVar135 = auVar102._12_4_;
      fVar136 = auVar102._16_4_;
      fVar206 = auVar102._20_4_;
      fVar207 = auVar102._24_4_;
      auVar103._4_4_ = fVar132 * fVar132 * fVar132 * auVar79._4_4_ * -0.5;
      auVar103._0_4_ = fVar134 * fVar134 * fVar134 * auVar79._0_4_ * -0.5;
      auVar103._8_4_ = fVar133 * fVar133 * fVar133 * auVar79._8_4_ * -0.5;
      auVar103._12_4_ = fVar135 * fVar135 * fVar135 * auVar79._12_4_ * -0.5;
      auVar103._16_4_ = fVar136 * fVar136 * fVar136 * -0.0;
      auVar103._20_4_ = fVar206 * fVar206 * fVar206 * -0.0;
      auVar103._24_4_ = fVar207 * fVar207 * fVar207 * -0.0;
      auVar103._28_4_ = 0;
      auVar87 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar87,auVar102);
      auVar104._4_4_ = auVar106._4_4_ * auVar103._4_4_;
      auVar104._0_4_ = auVar106._0_4_ * auVar103._0_4_;
      auVar104._8_4_ = auVar106._8_4_ * auVar103._8_4_;
      auVar104._12_4_ = auVar106._12_4_ * auVar103._12_4_;
      auVar104._16_4_ = fVar198 * auVar103._16_4_;
      auVar104._20_4_ = fVar199 * auVar103._20_4_;
      auVar104._24_4_ = fVar166 * auVar103._24_4_;
      auVar104._28_4_ = auVar102._28_4_;
      auVar102._4_4_ = auVar103._4_4_ * -auVar105._4_4_;
      auVar102._0_4_ = auVar103._0_4_ * -auVar105._0_4_;
      auVar102._8_4_ = auVar103._8_4_ * -auVar105._8_4_;
      auVar102._12_4_ = auVar103._12_4_ * -auVar105._12_4_;
      auVar102._16_4_ = auVar103._16_4_ * -fVar197;
      auVar102._20_4_ = auVar103._20_4_ * -fVar155;
      auVar102._24_4_ = auVar103._24_4_ * -fVar196;
      auVar102._28_4_ = uVar57 ^ 0x80000000;
      auVar88 = vmulps_avx512vl(auVar103,ZEXT1632(auVar86));
      auVar93 = ZEXT1632(auVar86);
      auVar101 = vfmadd213ps_avx512vl(auVar107,auVar107,auVar93);
      auVar79 = vfmadd231ps_fma(auVar101,auVar108,auVar108);
      auVar100 = vrsqrt14ps_avx512vl(ZEXT1632(auVar79));
      fVar155 = auVar100._0_4_;
      fVar196 = auVar100._4_4_;
      fVar197 = auVar100._8_4_;
      fVar198 = auVar100._12_4_;
      fVar199 = auVar100._16_4_;
      fVar166 = auVar100._20_4_;
      fVar134 = auVar100._24_4_;
      auVar101._4_4_ = fVar196 * fVar196 * fVar196 * auVar79._4_4_ * -0.5;
      auVar101._0_4_ = fVar155 * fVar155 * fVar155 * auVar79._0_4_ * -0.5;
      auVar101._8_4_ = fVar197 * fVar197 * fVar197 * auVar79._8_4_ * -0.5;
      auVar101._12_4_ = fVar198 * fVar198 * fVar198 * auVar79._12_4_ * -0.5;
      auVar101._16_4_ = fVar199 * fVar199 * fVar199 * -0.0;
      auVar101._20_4_ = fVar166 * fVar166 * fVar166 * -0.0;
      auVar101._24_4_ = fVar134 * fVar134 * fVar134 * -0.0;
      auVar101._28_4_ = 0;
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar87,auVar100);
      auVar89._4_4_ = auVar108._4_4_ * auVar101._4_4_;
      auVar89._0_4_ = auVar108._0_4_ * auVar101._0_4_;
      auVar89._8_4_ = auVar108._8_4_ * auVar101._8_4_;
      auVar89._12_4_ = auVar108._12_4_ * auVar101._12_4_;
      auVar89._16_4_ = fVar130 * auVar101._16_4_;
      auVar89._20_4_ = fVar67 * auVar101._20_4_;
      auVar89._24_4_ = fVar131 * auVar101._24_4_;
      auVar89._28_4_ = auVar100._28_4_;
      auVar100._4_4_ = -auVar107._4_4_ * auVar101._4_4_;
      auVar100._0_4_ = -auVar107._0_4_ * auVar101._0_4_;
      auVar100._8_4_ = -auVar107._8_4_ * auVar101._8_4_;
      auVar100._12_4_ = -auVar107._12_4_ * auVar101._12_4_;
      auVar100._16_4_ = -fVar167 * auVar101._16_4_;
      auVar100._20_4_ = -fVar168 * auVar101._20_4_;
      auVar100._24_4_ = -fVar169 * auVar101._24_4_;
      auVar100._28_4_ = auVar103._28_4_;
      auVar103 = vmulps_avx512vl(auVar101,auVar93);
      auVar79 = vfmadd213ps_fma(auVar104,auVar96,auVar90);
      auVar82 = vfmadd213ps_fma(auVar102,auVar96,auVar91);
      auVar101 = vfmadd213ps_avx512vl(auVar88,auVar96,auVar98);
      auVar87 = vfmadd213ps_avx512vl(auVar89,ZEXT1632(auVar71),ZEXT1632(auVar75));
      auVar18 = vfnmadd213ps_fma(auVar104,auVar96,auVar90);
      auVar90 = ZEXT1632(auVar71);
      auVar104 = vfmadd213ps_avx512vl(auVar100,auVar90,auVar92);
      auVar77 = vfnmadd213ps_fma(auVar102,auVar96,auVar91);
      auVar81 = vfmadd213ps_fma(auVar103,auVar90,auVar97);
      auVar102 = vfnmadd231ps_avx512vl(auVar98,auVar96,auVar88);
      auVar75 = vfnmadd213ps_fma(auVar89,auVar90,ZEXT1632(auVar75));
      auVar88 = vfnmadd213ps_avx512vl(auVar100,auVar90,auVar92);
      auVar78 = vfnmadd231ps_fma(auVar97,ZEXT1632(auVar71),auVar103);
      auVar89 = vsubps_avx512vl(auVar87,ZEXT1632(auVar18));
      auVar103 = vsubps_avx(auVar104,ZEXT1632(auVar77));
      auVar100 = vsubps_avx512vl(ZEXT1632(auVar81),auVar102);
      auVar90 = vmulps_avx512vl(auVar103,auVar102);
      auVar80 = vfmsub231ps_fma(auVar90,ZEXT1632(auVar77),auVar100);
      auVar90._4_4_ = auVar18._4_4_ * auVar100._4_4_;
      auVar90._0_4_ = auVar18._0_4_ * auVar100._0_4_;
      auVar90._8_4_ = auVar18._8_4_ * auVar100._8_4_;
      auVar90._12_4_ = auVar18._12_4_ * auVar100._12_4_;
      auVar90._16_4_ = auVar100._16_4_ * 0.0;
      auVar90._20_4_ = auVar100._20_4_ * 0.0;
      auVar90._24_4_ = auVar100._24_4_ * 0.0;
      auVar90._28_4_ = auVar100._28_4_;
      auVar100 = vfmsub231ps_avx512vl(auVar90,auVar102,auVar89);
      auVar91._4_4_ = auVar77._4_4_ * auVar89._4_4_;
      auVar91._0_4_ = auVar77._0_4_ * auVar89._0_4_;
      auVar91._8_4_ = auVar77._8_4_ * auVar89._8_4_;
      auVar91._12_4_ = auVar77._12_4_ * auVar89._12_4_;
      auVar91._16_4_ = auVar89._16_4_ * 0.0;
      auVar91._20_4_ = auVar89._20_4_ * 0.0;
      auVar91._24_4_ = auVar89._24_4_ * 0.0;
      auVar91._28_4_ = auVar89._28_4_;
      auVar7 = vfmsub231ps_fma(auVar91,ZEXT1632(auVar18),auVar103);
      auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar7),auVar93,auVar100);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar93,ZEXT1632(auVar80));
      auVar97 = ZEXT1632(auVar86);
      uVar56 = vcmpps_avx512vl(auVar103,auVar97,2);
      bVar55 = (byte)uVar56;
      fVar67 = (float)((uint)(bVar55 & 1) * auVar79._0_4_ |
                      (uint)!(bool)(bVar55 & 1) * auVar75._0_4_);
      bVar12 = (bool)((byte)(uVar56 >> 1) & 1);
      fVar130 = (float)((uint)bVar12 * auVar79._4_4_ | (uint)!bVar12 * auVar75._4_4_);
      bVar12 = (bool)((byte)(uVar56 >> 2) & 1);
      fVar131 = (float)((uint)bVar12 * auVar79._8_4_ | (uint)!bVar12 * auVar75._8_4_);
      bVar12 = (bool)((byte)(uVar56 >> 3) & 1);
      fVar134 = (float)((uint)bVar12 * auVar79._12_4_ | (uint)!bVar12 * auVar75._12_4_);
      auVar89 = ZEXT1632(CONCAT412(fVar134,CONCAT48(fVar131,CONCAT44(fVar130,fVar67))));
      auVar98._0_4_ =
           (float)((uint)(bVar55 & 1) * auVar82._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar88._0_4_);
      bVar12 = (bool)((byte)(uVar56 >> 1) & 1);
      auVar98._4_4_ = (float)((uint)bVar12 * auVar82._4_4_ | (uint)!bVar12 * auVar88._4_4_);
      bVar12 = (bool)((byte)(uVar56 >> 2) & 1);
      auVar98._8_4_ = (float)((uint)bVar12 * auVar82._8_4_ | (uint)!bVar12 * auVar88._8_4_);
      bVar12 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar98._12_4_ = (float)((uint)bVar12 * auVar82._12_4_ | (uint)!bVar12 * auVar88._12_4_);
      fVar169 = (float)((uint)!(bool)((byte)(uVar56 >> 4) & 1) * auVar88._16_4_);
      auVar98._16_4_ = fVar169;
      fVar168 = (float)((uint)!(bool)((byte)(uVar56 >> 5) & 1) * auVar88._20_4_);
      auVar98._20_4_ = fVar168;
      fVar167 = (float)((uint)!(bool)((byte)(uVar56 >> 6) & 1) * auVar88._24_4_);
      auVar98._24_4_ = fVar167;
      auVar98._28_4_ = (uint)!SUB81(uVar56 >> 7,0) * auVar88._28_4_;
      auVar109._0_4_ =
           (float)((uint)(bVar55 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar78._0_4_);
      bVar12 = (bool)((byte)(uVar56 >> 1) & 1);
      auVar109._4_4_ = (float)((uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * auVar78._4_4_);
      bVar12 = (bool)((byte)(uVar56 >> 2) & 1);
      auVar109._8_4_ = (float)((uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * auVar78._8_4_);
      bVar12 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar109._12_4_ = (float)((uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * auVar78._12_4_);
      fVar155 = (float)((uint)((byte)(uVar56 >> 4) & 1) * auVar101._16_4_);
      auVar109._16_4_ = fVar155;
      fVar196 = (float)((uint)((byte)(uVar56 >> 5) & 1) * auVar101._20_4_);
      auVar109._20_4_ = fVar196;
      fVar197 = (float)((uint)((byte)(uVar56 >> 6) & 1) * auVar101._24_4_);
      auVar109._24_4_ = fVar197;
      iVar1 = (uint)(byte)(uVar56 >> 7) * auVar101._28_4_;
      auVar109._28_4_ = iVar1;
      auVar88 = vblendmps_avx512vl(ZEXT1632(auVar18),auVar87);
      auVar110._0_4_ =
           (uint)(bVar55 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar80._0_4_;
      bVar12 = (bool)((byte)(uVar56 >> 1) & 1);
      auVar110._4_4_ = (uint)bVar12 * auVar88._4_4_ | (uint)!bVar12 * auVar80._4_4_;
      bVar12 = (bool)((byte)(uVar56 >> 2) & 1);
      auVar110._8_4_ = (uint)bVar12 * auVar88._8_4_ | (uint)!bVar12 * auVar80._8_4_;
      bVar12 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar110._12_4_ = (uint)bVar12 * auVar88._12_4_ | (uint)!bVar12 * auVar80._12_4_;
      auVar110._16_4_ = (uint)((byte)(uVar56 >> 4) & 1) * auVar88._16_4_;
      auVar110._20_4_ = (uint)((byte)(uVar56 >> 5) & 1) * auVar88._20_4_;
      auVar110._24_4_ = (uint)((byte)(uVar56 >> 6) & 1) * auVar88._24_4_;
      auVar110._28_4_ = (uint)(byte)(uVar56 >> 7) * auVar88._28_4_;
      auVar88 = vblendmps_avx512vl(ZEXT1632(auVar77),auVar104);
      auVar111._0_4_ =
           (float)((uint)(bVar55 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar82._0_4_);
      bVar12 = (bool)((byte)(uVar56 >> 1) & 1);
      auVar111._4_4_ = (float)((uint)bVar12 * auVar88._4_4_ | (uint)!bVar12 * auVar82._4_4_);
      bVar12 = (bool)((byte)(uVar56 >> 2) & 1);
      auVar111._8_4_ = (float)((uint)bVar12 * auVar88._8_4_ | (uint)!bVar12 * auVar82._8_4_);
      bVar12 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar111._12_4_ = (float)((uint)bVar12 * auVar88._12_4_ | (uint)!bVar12 * auVar82._12_4_);
      fVar198 = (float)((uint)((byte)(uVar56 >> 4) & 1) * auVar88._16_4_);
      auVar111._16_4_ = fVar198;
      fVar199 = (float)((uint)((byte)(uVar56 >> 5) & 1) * auVar88._20_4_);
      auVar111._20_4_ = fVar199;
      fVar166 = (float)((uint)((byte)(uVar56 >> 6) & 1) * auVar88._24_4_);
      auVar111._24_4_ = fVar166;
      auVar111._28_4_ = (uint)(byte)(uVar56 >> 7) * auVar88._28_4_;
      auVar88 = vblendmps_avx512vl(auVar102,ZEXT1632(auVar81));
      auVar112._0_4_ =
           (float)((uint)(bVar55 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar101._0_4_);
      bVar12 = (bool)((byte)(uVar56 >> 1) & 1);
      auVar112._4_4_ = (float)((uint)bVar12 * auVar88._4_4_ | (uint)!bVar12 * auVar101._4_4_);
      bVar12 = (bool)((byte)(uVar56 >> 2) & 1);
      auVar112._8_4_ = (float)((uint)bVar12 * auVar88._8_4_ | (uint)!bVar12 * auVar101._8_4_);
      bVar12 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar112._12_4_ = (float)((uint)bVar12 * auVar88._12_4_ | (uint)!bVar12 * auVar101._12_4_);
      bVar12 = (bool)((byte)(uVar56 >> 4) & 1);
      auVar112._16_4_ = (float)((uint)bVar12 * auVar88._16_4_ | (uint)!bVar12 * auVar101._16_4_);
      bVar12 = (bool)((byte)(uVar56 >> 5) & 1);
      auVar112._20_4_ = (float)((uint)bVar12 * auVar88._20_4_ | (uint)!bVar12 * auVar101._20_4_);
      bVar12 = (bool)((byte)(uVar56 >> 6) & 1);
      auVar112._24_4_ = (float)((uint)bVar12 * auVar88._24_4_ | (uint)!bVar12 * auVar101._24_4_);
      bVar12 = SUB81(uVar56 >> 7,0);
      auVar112._28_4_ = (uint)bVar12 * auVar88._28_4_ | (uint)!bVar12 * auVar101._28_4_;
      auVar113._0_4_ =
           (uint)(bVar55 & 1) * (int)auVar18._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar87._0_4_;
      bVar12 = (bool)((byte)(uVar56 >> 1) & 1);
      auVar113._4_4_ = (uint)bVar12 * (int)auVar18._4_4_ | (uint)!bVar12 * auVar87._4_4_;
      bVar12 = (bool)((byte)(uVar56 >> 2) & 1);
      auVar113._8_4_ = (uint)bVar12 * (int)auVar18._8_4_ | (uint)!bVar12 * auVar87._8_4_;
      bVar12 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar113._12_4_ = (uint)bVar12 * (int)auVar18._12_4_ | (uint)!bVar12 * auVar87._12_4_;
      auVar113._16_4_ = (uint)!(bool)((byte)(uVar56 >> 4) & 1) * auVar87._16_4_;
      auVar113._20_4_ = (uint)!(bool)((byte)(uVar56 >> 5) & 1) * auVar87._20_4_;
      auVar113._24_4_ = (uint)!(bool)((byte)(uVar56 >> 6) & 1) * auVar87._24_4_;
      auVar113._28_4_ = (uint)!SUB81(uVar56 >> 7,0) * auVar87._28_4_;
      auVar114._0_4_ =
           (uint)(bVar55 & 1) * (int)auVar77._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar104._0_4_;
      bVar12 = (bool)((byte)(uVar56 >> 1) & 1);
      auVar114._4_4_ = (uint)bVar12 * (int)auVar77._4_4_ | (uint)!bVar12 * auVar104._4_4_;
      bVar12 = (bool)((byte)(uVar56 >> 2) & 1);
      auVar114._8_4_ = (uint)bVar12 * (int)auVar77._8_4_ | (uint)!bVar12 * auVar104._8_4_;
      bVar12 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar114._12_4_ = (uint)bVar12 * (int)auVar77._12_4_ | (uint)!bVar12 * auVar104._12_4_;
      auVar114._16_4_ = (uint)!(bool)((byte)(uVar56 >> 4) & 1) * auVar104._16_4_;
      auVar114._20_4_ = (uint)!(bool)((byte)(uVar56 >> 5) & 1) * auVar104._20_4_;
      auVar114._24_4_ = (uint)!(bool)((byte)(uVar56 >> 6) & 1) * auVar104._24_4_;
      auVar114._28_4_ = (uint)!SUB81(uVar56 >> 7,0) * auVar104._28_4_;
      auVar115._0_4_ =
           (uint)(bVar55 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar81._0_4_;
      bVar12 = (bool)((byte)(uVar56 >> 1) & 1);
      auVar115._4_4_ = (uint)bVar12 * auVar102._4_4_ | (uint)!bVar12 * auVar81._4_4_;
      bVar12 = (bool)((byte)(uVar56 >> 2) & 1);
      auVar115._8_4_ = (uint)bVar12 * auVar102._8_4_ | (uint)!bVar12 * auVar81._8_4_;
      bVar12 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar115._12_4_ = (uint)bVar12 * auVar102._12_4_ | (uint)!bVar12 * auVar81._12_4_;
      auVar115._16_4_ = (uint)((byte)(uVar56 >> 4) & 1) * auVar102._16_4_;
      auVar115._20_4_ = (uint)((byte)(uVar56 >> 5) & 1) * auVar102._20_4_;
      auVar115._24_4_ = (uint)((byte)(uVar56 >> 6) & 1) * auVar102._24_4_;
      iVar2 = (uint)(byte)(uVar56 >> 7) * auVar102._28_4_;
      auVar115._28_4_ = iVar2;
      auVar100 = vsubps_avx512vl(auVar113,auVar89);
      auVar104 = vsubps_avx(auVar114,auVar98);
      auVar189 = ZEXT3264(auVar104);
      auVar102 = vsubps_avx(auVar115,auVar109);
      auVar101 = vsubps_avx(auVar89,auVar110);
      auVar192 = ZEXT3264(auVar101);
      auVar87 = vsubps_avx(auVar98,auVar111);
      auVar88 = vsubps_avx(auVar109,auVar112);
      auVar92._4_4_ = auVar102._4_4_ * fVar130;
      auVar92._0_4_ = auVar102._0_4_ * fVar67;
      auVar92._8_4_ = auVar102._8_4_ * fVar131;
      auVar92._12_4_ = auVar102._12_4_ * fVar134;
      auVar92._16_4_ = auVar102._16_4_ * 0.0;
      auVar92._20_4_ = auVar102._20_4_ * 0.0;
      auVar92._24_4_ = auVar102._24_4_ * 0.0;
      auVar92._28_4_ = iVar2;
      auVar79 = vfmsub231ps_fma(auVar92,auVar109,auVar100);
      auVar93._4_4_ = auVar98._4_4_ * auVar100._4_4_;
      auVar93._0_4_ = auVar98._0_4_ * auVar100._0_4_;
      auVar93._8_4_ = auVar98._8_4_ * auVar100._8_4_;
      auVar93._12_4_ = auVar98._12_4_ * auVar100._12_4_;
      auVar93._16_4_ = fVar169 * auVar100._16_4_;
      auVar93._20_4_ = fVar168 * auVar100._20_4_;
      auVar93._24_4_ = fVar167 * auVar100._24_4_;
      auVar93._28_4_ = auVar103._28_4_;
      auVar82 = vfmsub231ps_fma(auVar93,auVar89,auVar104);
      auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar97,ZEXT1632(auVar79));
      auVar179._0_4_ = auVar104._0_4_ * auVar109._0_4_;
      auVar179._4_4_ = auVar104._4_4_ * auVar109._4_4_;
      auVar179._8_4_ = auVar104._8_4_ * auVar109._8_4_;
      auVar179._12_4_ = auVar104._12_4_ * auVar109._12_4_;
      auVar179._16_4_ = auVar104._16_4_ * fVar155;
      auVar179._20_4_ = auVar104._20_4_ * fVar196;
      auVar179._24_4_ = auVar104._24_4_ * fVar197;
      auVar179._28_4_ = 0;
      auVar79 = vfmsub231ps_fma(auVar179,auVar98,auVar102);
      auVar90 = vfmadd231ps_avx512vl(auVar103,auVar97,ZEXT1632(auVar79));
      auVar103 = vmulps_avx512vl(auVar88,auVar110);
      auVar103 = vfmsub231ps_avx512vl(auVar103,auVar101,auVar112);
      auVar94._4_4_ = auVar87._4_4_ * auVar112._4_4_;
      auVar94._0_4_ = auVar87._0_4_ * auVar112._0_4_;
      auVar94._8_4_ = auVar87._8_4_ * auVar112._8_4_;
      auVar94._12_4_ = auVar87._12_4_ * auVar112._12_4_;
      auVar94._16_4_ = auVar87._16_4_ * auVar112._16_4_;
      auVar94._20_4_ = auVar87._20_4_ * auVar112._20_4_;
      auVar94._24_4_ = auVar87._24_4_ * auVar112._24_4_;
      auVar94._28_4_ = auVar112._28_4_;
      auVar79 = vfmsub231ps_fma(auVar94,auVar111,auVar88);
      auVar180._0_4_ = auVar111._0_4_ * auVar101._0_4_;
      auVar180._4_4_ = auVar111._4_4_ * auVar101._4_4_;
      auVar180._8_4_ = auVar111._8_4_ * auVar101._8_4_;
      auVar180._12_4_ = auVar111._12_4_ * auVar101._12_4_;
      auVar180._16_4_ = fVar198 * auVar101._16_4_;
      auVar180._20_4_ = fVar199 * auVar101._20_4_;
      auVar180._24_4_ = fVar166 * auVar101._24_4_;
      auVar180._28_4_ = 0;
      auVar82 = vfmsub231ps_fma(auVar180,auVar87,auVar110);
      auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar97,auVar103);
      auVar91 = vfmadd231ps_avx512vl(auVar103,auVar97,ZEXT1632(auVar79));
      auVar183 = ZEXT3264(auVar91);
      auVar103 = vmaxps_avx(auVar90,auVar91);
      uVar147 = vcmpps_avx512vl(auVar103,auVar97,2);
      bVar64 = bVar64 & (byte)uVar147;
      if (bVar64 != 0) {
        auVar33._4_4_ = auVar88._4_4_ * auVar104._4_4_;
        auVar33._0_4_ = auVar88._0_4_ * auVar104._0_4_;
        auVar33._8_4_ = auVar88._8_4_ * auVar104._8_4_;
        auVar33._12_4_ = auVar88._12_4_ * auVar104._12_4_;
        auVar33._16_4_ = auVar88._16_4_ * auVar104._16_4_;
        auVar33._20_4_ = auVar88._20_4_ * auVar104._20_4_;
        auVar33._24_4_ = auVar88._24_4_ * auVar104._24_4_;
        auVar33._28_4_ = auVar103._28_4_;
        auVar80 = vfmsub231ps_fma(auVar33,auVar87,auVar102);
        auVar34._4_4_ = auVar102._4_4_ * auVar101._4_4_;
        auVar34._0_4_ = auVar102._0_4_ * auVar101._0_4_;
        auVar34._8_4_ = auVar102._8_4_ * auVar101._8_4_;
        auVar34._12_4_ = auVar102._12_4_ * auVar101._12_4_;
        auVar34._16_4_ = auVar102._16_4_ * auVar101._16_4_;
        auVar34._20_4_ = auVar102._20_4_ * auVar101._20_4_;
        auVar34._24_4_ = auVar102._24_4_ * auVar101._24_4_;
        auVar34._28_4_ = auVar102._28_4_;
        auVar81 = vfmsub231ps_fma(auVar34,auVar100,auVar88);
        auVar35._4_4_ = auVar87._4_4_ * auVar100._4_4_;
        auVar35._0_4_ = auVar87._0_4_ * auVar100._0_4_;
        auVar35._8_4_ = auVar87._8_4_ * auVar100._8_4_;
        auVar35._12_4_ = auVar87._12_4_ * auVar100._12_4_;
        auVar35._16_4_ = auVar87._16_4_ * auVar100._16_4_;
        auVar35._20_4_ = auVar87._20_4_ * auVar100._20_4_;
        auVar35._24_4_ = auVar87._24_4_ * auVar100._24_4_;
        auVar35._28_4_ = auVar87._28_4_;
        auVar7 = vfmsub231ps_fma(auVar35,auVar101,auVar104);
        auVar79 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar81),ZEXT1632(auVar7));
        auVar82 = vfmadd231ps_fma(ZEXT1632(auVar79),ZEXT1632(auVar80),ZEXT1232(ZEXT412(0)) << 0x20);
        auVar103 = vrcp14ps_avx512vl(ZEXT1632(auVar82));
        auVar24._8_4_ = 0x3f800000;
        auVar24._0_8_ = 0x3f8000003f800000;
        auVar24._12_4_ = 0x3f800000;
        auVar24._16_4_ = 0x3f800000;
        auVar24._20_4_ = 0x3f800000;
        auVar24._24_4_ = 0x3f800000;
        auVar24._28_4_ = 0x3f800000;
        auVar104 = vfnmadd213ps_avx512vl(auVar103,ZEXT1632(auVar82),auVar24);
        auVar79 = vfmadd132ps_fma(auVar104,auVar103,auVar103);
        auVar189 = ZEXT1664(auVar79);
        auVar36._4_4_ = auVar7._4_4_ * auVar109._4_4_;
        auVar36._0_4_ = auVar7._0_4_ * auVar109._0_4_;
        auVar36._8_4_ = auVar7._8_4_ * auVar109._8_4_;
        auVar36._12_4_ = auVar7._12_4_ * auVar109._12_4_;
        auVar36._16_4_ = fVar155 * 0.0;
        auVar36._20_4_ = fVar196 * 0.0;
        auVar36._24_4_ = fVar197 * 0.0;
        auVar36._28_4_ = iVar1;
        auVar81 = vfmadd231ps_fma(auVar36,auVar98,ZEXT1632(auVar81));
        auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar89,ZEXT1632(auVar80));
        fVar196 = auVar79._0_4_;
        fVar197 = auVar79._4_4_;
        fVar198 = auVar79._8_4_;
        fVar199 = auVar79._12_4_;
        local_240._28_4_ = auVar103._28_4_;
        local_240._0_28_ =
             ZEXT1628(CONCAT412(auVar81._12_4_ * fVar199,
                                CONCAT48(auVar81._8_4_ * fVar198,
                                         CONCAT44(auVar81._4_4_ * fVar197,auVar81._0_4_ * fVar196)))
                     );
        auVar192 = ZEXT3264(local_240);
        auVar140._8_4_ = 3;
        auVar140._0_8_ = 0x300000003;
        auVar140._12_4_ = 3;
        auVar140._16_4_ = 3;
        auVar140._20_4_ = 3;
        auVar140._24_4_ = 3;
        auVar140._28_4_ = 3;
        auVar103 = vpermps_avx2(auVar140,ZEXT1632((undefined1  [16])aVar4));
        uVar147 = vcmpps_avx512vl(auVar103,local_240,2);
        fVar155 = (ray->super_RayK<1>).tfar;
        auVar25._4_4_ = fVar155;
        auVar25._0_4_ = fVar155;
        auVar25._8_4_ = fVar155;
        auVar25._12_4_ = fVar155;
        auVar25._16_4_ = fVar155;
        auVar25._20_4_ = fVar155;
        auVar25._24_4_ = fVar155;
        auVar25._28_4_ = fVar155;
        uVar21 = vcmpps_avx512vl(local_240,auVar25,2);
        bVar64 = (byte)uVar147 & (byte)uVar21 & bVar64;
        if (bVar64 != 0) {
          uVar66 = vcmpps_avx512vl(ZEXT1632(auVar82),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar66 = bVar64 & uVar66;
          if ((char)uVar66 != '\0') {
            fVar155 = auVar90._0_4_ * fVar196;
            fVar166 = auVar90._4_4_ * fVar197;
            auVar37._4_4_ = fVar166;
            auVar37._0_4_ = fVar155;
            fVar167 = auVar90._8_4_ * fVar198;
            auVar37._8_4_ = fVar167;
            fVar168 = auVar90._12_4_ * fVar199;
            auVar37._12_4_ = fVar168;
            fVar169 = auVar90._16_4_ * 0.0;
            auVar37._16_4_ = fVar169;
            fVar67 = auVar90._20_4_ * 0.0;
            auVar37._20_4_ = fVar67;
            fVar130 = auVar90._24_4_ * 0.0;
            auVar37._24_4_ = fVar130;
            auVar37._28_4_ = auVar90._28_4_;
            auVar141._8_4_ = 0x3f800000;
            auVar141._0_8_ = 0x3f8000003f800000;
            auVar141._12_4_ = 0x3f800000;
            auVar141._16_4_ = 0x3f800000;
            auVar141._20_4_ = 0x3f800000;
            auVar141._24_4_ = 0x3f800000;
            auVar141._28_4_ = 0x3f800000;
            auVar103 = vsubps_avx(auVar141,auVar37);
            local_280._0_4_ =
                 (float)((uint)(bVar55 & 1) * (int)fVar155 |
                        (uint)!(bool)(bVar55 & 1) * auVar103._0_4_);
            bVar12 = (bool)((byte)(uVar56 >> 1) & 1);
            local_280._4_4_ = (float)((uint)bVar12 * (int)fVar166 | (uint)!bVar12 * auVar103._4_4_);
            bVar12 = (bool)((byte)(uVar56 >> 2) & 1);
            local_280._8_4_ = (float)((uint)bVar12 * (int)fVar167 | (uint)!bVar12 * auVar103._8_4_);
            bVar12 = (bool)((byte)(uVar56 >> 3) & 1);
            local_280._12_4_ =
                 (float)((uint)bVar12 * (int)fVar168 | (uint)!bVar12 * auVar103._12_4_);
            bVar12 = (bool)((byte)(uVar56 >> 4) & 1);
            local_280._16_4_ =
                 (float)((uint)bVar12 * (int)fVar169 | (uint)!bVar12 * auVar103._16_4_);
            bVar12 = (bool)((byte)(uVar56 >> 5) & 1);
            local_280._20_4_ = (float)((uint)bVar12 * (int)fVar67 | (uint)!bVar12 * auVar103._20_4_)
            ;
            bVar12 = (bool)((byte)(uVar56 >> 6) & 1);
            local_280._24_4_ =
                 (float)((uint)bVar12 * (int)fVar130 | (uint)!bVar12 * auVar103._24_4_);
            bVar12 = SUB81(uVar56 >> 7,0);
            local_280._28_4_ =
                 (float)((uint)bVar12 * auVar90._28_4_ | (uint)!bVar12 * auVar103._28_4_);
            auVar103 = vsubps_avx(ZEXT1632(auVar71),auVar96);
            auVar79 = vfmadd213ps_fma(auVar103,local_280,auVar96);
            fVar155 = local_528->depth_scale;
            auVar96._4_4_ = fVar155;
            auVar96._0_4_ = fVar155;
            auVar96._8_4_ = fVar155;
            auVar96._12_4_ = fVar155;
            auVar96._16_4_ = fVar155;
            auVar96._20_4_ = fVar155;
            auVar96._24_4_ = fVar155;
            auVar96._28_4_ = fVar155;
            auVar103 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar79._12_4_ + auVar79._12_4_,
                                                          CONCAT48(auVar79._8_4_ + auVar79._8_4_,
                                                                   CONCAT44(auVar79._4_4_ +
                                                                            auVar79._4_4_,
                                                                            auVar79._0_4_ +
                                                                            auVar79._0_4_)))),
                                       auVar96);
            uVar20 = vcmpps_avx512vl(local_240,auVar103,6);
            uVar66 = uVar66 & uVar20;
            bVar64 = (byte)uVar66;
            if (bVar64 != 0) {
              auVar164._0_4_ = auVar91._0_4_ * fVar196;
              auVar164._4_4_ = auVar91._4_4_ * fVar197;
              auVar164._8_4_ = auVar91._8_4_ * fVar198;
              auVar164._12_4_ = auVar91._12_4_ * fVar199;
              auVar164._16_4_ = auVar91._16_4_ * 0.0;
              auVar164._20_4_ = auVar91._20_4_ * 0.0;
              auVar164._24_4_ = auVar91._24_4_ * 0.0;
              auVar164._28_4_ = 0;
              auVar174._8_4_ = 0x3f800000;
              auVar174._0_8_ = 0x3f8000003f800000;
              auVar174._12_4_ = 0x3f800000;
              auVar174._16_4_ = 0x3f800000;
              auVar174._20_4_ = 0x3f800000;
              auVar174._24_4_ = 0x3f800000;
              auVar174._28_4_ = 0x3f800000;
              auVar103 = vsubps_avx(auVar174,auVar164);
              auVar116._0_4_ =
                   (uint)(bVar55 & 1) * (int)auVar164._0_4_ |
                   (uint)!(bool)(bVar55 & 1) * auVar103._0_4_;
              bVar12 = (bool)((byte)(uVar56 >> 1) & 1);
              auVar116._4_4_ = (uint)bVar12 * (int)auVar164._4_4_ | (uint)!bVar12 * auVar103._4_4_;
              bVar12 = (bool)((byte)(uVar56 >> 2) & 1);
              auVar116._8_4_ = (uint)bVar12 * (int)auVar164._8_4_ | (uint)!bVar12 * auVar103._8_4_;
              bVar12 = (bool)((byte)(uVar56 >> 3) & 1);
              auVar116._12_4_ =
                   (uint)bVar12 * (int)auVar164._12_4_ | (uint)!bVar12 * auVar103._12_4_;
              bVar12 = (bool)((byte)(uVar56 >> 4) & 1);
              auVar116._16_4_ =
                   (uint)bVar12 * (int)auVar164._16_4_ | (uint)!bVar12 * auVar103._16_4_;
              bVar12 = (bool)((byte)(uVar56 >> 5) & 1);
              auVar116._20_4_ =
                   (uint)bVar12 * (int)auVar164._20_4_ | (uint)!bVar12 * auVar103._20_4_;
              bVar12 = (bool)((byte)(uVar56 >> 6) & 1);
              auVar116._24_4_ =
                   (uint)bVar12 * (int)auVar164._24_4_ | (uint)!bVar12 * auVar103._24_4_;
              auVar116._28_4_ = (uint)!SUB81(uVar56 >> 7,0) * auVar103._28_4_;
              auVar26._8_4_ = 0x40000000;
              auVar26._0_8_ = 0x4000000040000000;
              auVar26._12_4_ = 0x40000000;
              auVar26._16_4_ = 0x40000000;
              auVar26._20_4_ = 0x40000000;
              auVar26._24_4_ = 0x40000000;
              auVar26._28_4_ = 0x40000000;
              local_260 = vfmsub132ps_avx512vl(auVar116,auVar174,auVar26);
              local_220 = 0;
              local_21c = iVar8;
              local_210 = local_4c0._0_8_;
              uStack_208 = local_4c0._8_8_;
              local_200 = local_4e0._0_8_;
              uStack_1f8 = local_4e0._8_8_;
              local_1f0 = local_4f0._0_8_;
              uStack_1e8 = local_4f0._8_8_;
              local_1e0 = local_4d0;
              uStack_1d8 = uStack_4c8;
              if ((pGVar60->mask & (ray->super_RayK<1>).mask) != 0) {
                fVar155 = 1.0 / (float)local_400._0_4_;
                local_1c0[0] = fVar155 * (local_280._0_4_ + 0.0);
                local_1c0[1] = fVar155 * (local_280._4_4_ + 1.0);
                local_1c0[2] = fVar155 * (local_280._8_4_ + 2.0);
                local_1c0[3] = fVar155 * (local_280._12_4_ + 3.0);
                fStack_1b0 = fVar155 * (local_280._16_4_ + 4.0);
                fStack_1ac = fVar155 * (local_280._20_4_ + 5.0);
                fStack_1a8 = fVar155 * (local_280._24_4_ + 6.0);
                fStack_1a4 = local_280._28_4_ + 7.0;
                local_1a0 = local_260;
                local_180 = local_240;
                auVar142._8_4_ = 0x7f800000;
                auVar142._0_8_ = 0x7f8000007f800000;
                auVar142._12_4_ = 0x7f800000;
                auVar142._16_4_ = 0x7f800000;
                auVar142._20_4_ = 0x7f800000;
                auVar142._24_4_ = 0x7f800000;
                auVar142._28_4_ = 0x7f800000;
                auVar103 = vblendmps_avx512vl(auVar142,local_240);
                auVar117._0_4_ =
                     (uint)(bVar64 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar64 & 1) * 0x7f800000;
                bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
                auVar117._4_4_ = (uint)bVar12 * auVar103._4_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
                auVar117._8_4_ = (uint)bVar12 * auVar103._8_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
                auVar117._12_4_ = (uint)bVar12 * auVar103._12_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar66 >> 4) & 1);
                auVar117._16_4_ = (uint)bVar12 * auVar103._16_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar66 >> 5) & 1);
                auVar117._20_4_ = (uint)bVar12 * auVar103._20_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar66 >> 6) & 1);
                auVar117._24_4_ = (uint)bVar12 * auVar103._24_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = SUB81(uVar66 >> 7,0);
                auVar117._28_4_ = (uint)bVar12 * auVar103._28_4_ | (uint)!bVar12 * 0x7f800000;
                auVar103 = vshufps_avx(auVar117,auVar117,0xb1);
                auVar103 = vminps_avx(auVar117,auVar103);
                auVar104 = vshufpd_avx(auVar103,auVar103,5);
                auVar103 = vminps_avx(auVar103,auVar104);
                auVar104 = vpermpd_avx2(auVar103,0x4e);
                auVar103 = vminps_avx(auVar103,auVar104);
                uVar147 = vcmpps_avx512vl(auVar117,auVar103,0);
                uVar57 = (uint)uVar66;
                if ((bVar64 & (byte)uVar147) != 0) {
                  uVar57 = (uint)(bVar64 & (byte)uVar147);
                }
                uVar22 = 0;
                for (; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x80000000) {
                  uVar22 = uVar22 + 1;
                }
                uVar56 = (ulong)uVar22;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar60->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_420 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                  _local_3c0 = local_240;
                  local_440 = auVar99;
                  local_460 = auVar95;
                  do {
                    local_4a4 = local_1c0[uVar56];
                    local_4a0 = *(undefined4 *)(local_1a0 + uVar56 * 4);
                    (ray->super_RayK<1>).tfar = *(float *)(local_180 + uVar56 * 4);
                    local_520.context = local_540->user;
                    fVar196 = 1.0 - local_4a4;
                    fVar155 = fVar196 * fVar196 * -3.0;
                    auVar183 = ZEXT464((uint)fVar155);
                    auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar196 * fVar196)),
                                              ZEXT416((uint)(local_4a4 * fVar196)),
                                              ZEXT416(0xc0000000));
                    auVar82 = vfmsub132ss_fma(ZEXT416((uint)(local_4a4 * fVar196)),
                                              ZEXT416((uint)(local_4a4 * local_4a4)),
                                              ZEXT416(0x40000000));
                    fVar196 = auVar79._0_4_ * 3.0;
                    fVar197 = auVar82._0_4_ * 3.0;
                    fVar198 = local_4a4 * local_4a4 * 3.0;
                    auVar188._0_4_ = fVar198 * (float)local_4d0._0_4_;
                    auVar188._4_4_ = fVar198 * (float)local_4d0._4_4_;
                    auVar188._8_4_ = fVar198 * (float)uStack_4c8;
                    auVar188._12_4_ = fVar198 * uStack_4c8._4_4_;
                    auVar189 = ZEXT1664(auVar188);
                    auVar162._4_4_ = fVar197;
                    auVar162._0_4_ = fVar197;
                    auVar162._8_4_ = fVar197;
                    auVar162._12_4_ = fVar197;
                    auVar79 = vfmadd132ps_fma(auVar162,auVar188,local_4f0);
                    auVar173._4_4_ = fVar196;
                    auVar173._0_4_ = fVar196;
                    auVar173._8_4_ = fVar196;
                    auVar173._12_4_ = fVar196;
                    auVar79 = vfmadd132ps_fma(auVar173,auVar79,local_4e0);
                    auVar163._4_4_ = fVar155;
                    auVar163._0_4_ = fVar155;
                    auVar163._8_4_ = fVar155;
                    auVar163._12_4_ = fVar155;
                    auVar79 = vfmadd132ps_fma(auVar163,auVar79,local_4c0);
                    local_4b0 = vmovlps_avx(auVar79);
                    local_4a8 = vextractps_avx(auVar79,2);
                    local_49c = (int)local_538;
                    local_498 = (int)local_550;
                    local_494 = (local_520.context)->instID[0];
                    local_490 = (local_520.context)->instPrimID[0];
                    local_554 = -1;
                    local_520.valid = &local_554;
                    local_520.geometryUserPtr = pGVar60->userPtr;
                    local_520.ray = (RTCRayN *)ray;
                    local_520.hit = (RTCHitN *)&local_4b0;
                    local_520.N = 1;
                    if (pGVar60->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0191a935:
                      p_Var11 = local_540->args->filter;
                      if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                         (((local_540->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar60->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar183 = ZEXT1664(auVar183._0_16_);
                        auVar189 = ZEXT1664(auVar189._0_16_);
                        (*p_Var11)(&local_520);
                        auVar192 = ZEXT3264(_local_3c0);
                        auVar217 = ZEXT3264(local_460);
                        auVar218 = ZEXT3264(local_440);
                        auVar79 = vbroadcastss_avx512vl(ZEXT416(0xbeaaaaab));
                        auVar221 = ZEXT1664(auVar79);
                        auVar220 = ZEXT1664(local_480);
                        auVar79 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar219 = ZEXT1664(auVar79);
                        if (*local_520.valid == 0) goto LAB_0191a9fa;
                      }
                      (((Vec3f *)((long)local_520.ray + 0x30))->field_0).components[0] =
                           *(float *)local_520.hit;
                      (((Vec3f *)((long)local_520.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_520.hit + 4);
                      (((Vec3f *)((long)local_520.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_520.hit + 8);
                      *(float *)((long)local_520.ray + 0x3c) = *(float *)(local_520.hit + 0xc);
                      *(float *)((long)local_520.ray + 0x40) = *(float *)(local_520.hit + 0x10);
                      *(float *)((long)local_520.ray + 0x44) = *(float *)(local_520.hit + 0x14);
                      *(float *)((long)local_520.ray + 0x48) = *(float *)(local_520.hit + 0x18);
                      *(float *)((long)local_520.ray + 0x4c) = *(float *)(local_520.hit + 0x1c);
                      *(float *)((long)local_520.ray + 0x50) = *(float *)(local_520.hit + 0x20);
                    }
                    else {
                      auVar183 = ZEXT464((uint)fVar155);
                      auVar189 = ZEXT1664(auVar188);
                      (*pGVar60->intersectionFilterN)(&local_520);
                      auVar192 = ZEXT3264(_local_3c0);
                      auVar217 = ZEXT3264(local_460);
                      auVar218 = ZEXT3264(local_440);
                      auVar79 = vbroadcastss_avx512vl(ZEXT416(0xbeaaaaab));
                      auVar221 = ZEXT1664(auVar79);
                      auVar220 = ZEXT1664(local_480);
                      auVar79 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar219 = ZEXT1664(auVar79);
                      if (*local_520.valid != 0) goto LAB_0191a935;
LAB_0191a9fa:
                      (ray->super_RayK<1>).tfar = (float)local_420._0_4_;
                    }
                    auVar95 = auVar217._0_32_;
                    auVar99 = auVar218._0_32_;
                    bVar64 = ~(byte)(1 << ((uint)uVar56 & 0x1f)) & (byte)uVar66;
                    fVar155 = (ray->super_RayK<1>).tfar;
                    auVar32._4_4_ = fVar155;
                    auVar32._0_4_ = fVar155;
                    auVar32._8_4_ = fVar155;
                    auVar32._12_4_ = fVar155;
                    auVar32._16_4_ = fVar155;
                    auVar32._20_4_ = fVar155;
                    auVar32._24_4_ = fVar155;
                    auVar32._28_4_ = fVar155;
                    uVar147 = vcmpps_avx512vl(auVar192._0_32_,auVar32,2);
                    prim = local_530;
                    context = local_540;
                    if ((bVar64 & (byte)uVar147) == 0) goto LAB_01919b16;
                    local_420 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                    bVar64 = bVar64 & (byte)uVar147;
                    uVar66 = (ulong)bVar64;
                    auVar146._8_4_ = 0x7f800000;
                    auVar146._0_8_ = 0x7f8000007f800000;
                    auVar146._12_4_ = 0x7f800000;
                    auVar146._16_4_ = 0x7f800000;
                    auVar146._20_4_ = 0x7f800000;
                    auVar146._24_4_ = 0x7f800000;
                    auVar146._28_4_ = 0x7f800000;
                    auVar99 = vblendmps_avx512vl(auVar146,auVar192._0_32_);
                    auVar95._0_4_ =
                         (uint)(bVar64 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar64 & 1) * 0x7f800000
                    ;
                    bVar12 = (bool)(bVar64 >> 1 & 1);
                    auVar95._4_4_ = (uint)bVar12 * auVar99._4_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar64 >> 2 & 1);
                    auVar95._8_4_ = (uint)bVar12 * auVar99._8_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar64 >> 3 & 1);
                    auVar95._12_4_ = (uint)bVar12 * auVar99._12_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar64 >> 4 & 1);
                    auVar95._16_4_ = (uint)bVar12 * auVar99._16_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar64 >> 5 & 1);
                    auVar95._20_4_ = (uint)bVar12 * auVar99._20_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar64 >> 6 & 1);
                    auVar95._24_4_ = (uint)bVar12 * auVar99._24_4_ | (uint)!bVar12 * 0x7f800000;
                    auVar95._28_4_ =
                         (uint)(bVar64 >> 7) * auVar99._28_4_ |
                         (uint)!(bool)(bVar64 >> 7) * 0x7f800000;
                    auVar99 = vshufps_avx(auVar95,auVar95,0xb1);
                    auVar99 = vminps_avx(auVar95,auVar99);
                    auVar103 = vshufpd_avx(auVar99,auVar99,5);
                    auVar99 = vminps_avx(auVar99,auVar103);
                    auVar103 = vpermpd_avx2(auVar99,0x4e);
                    auVar99 = vminps_avx(auVar99,auVar103);
                    uVar147 = vcmpps_avx512vl(auVar95,auVar99,0);
                    bVar55 = (byte)uVar147 & bVar64;
                    if (bVar55 != 0) {
                      bVar64 = bVar55;
                    }
                    uVar65 = 0;
                    for (uVar58 = (uint)bVar64; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x80000000
                        ) {
                      uVar65 = uVar65 + 1;
                    }
                    uVar56 = (ulong)uVar65;
                  } while( true );
                }
                fVar155 = local_1c0[uVar56];
                fVar196 = *(float *)(local_1a0 + uVar56 * 4);
                fVar198 = 1.0 - fVar155;
                fVar197 = fVar198 * fVar198 * -3.0;
                auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar198 * fVar198)),
                                          ZEXT416((uint)(fVar155 * fVar198)),ZEXT416(0xc0000000));
                auVar82 = vfmsub132ss_fma(ZEXT416((uint)(fVar155 * fVar198)),
                                          ZEXT416((uint)(fVar155 * fVar155)),ZEXT416(0x40000000));
                fVar198 = auVar79._0_4_ * 3.0;
                fVar199 = auVar82._0_4_ * 3.0;
                fVar166 = fVar155 * fVar155 * 3.0;
                auVar185._0_4_ = fVar166 * (float)local_4d0._0_4_;
                auVar185._4_4_ = fVar166 * (float)local_4d0._4_4_;
                auVar185._8_4_ = fVar166 * (float)uStack_4c8;
                auVar185._12_4_ = fVar166 * uStack_4c8._4_4_;
                auVar189 = ZEXT1664(auVar185);
                auVar156._4_4_ = fVar199;
                auVar156._0_4_ = fVar199;
                auVar156._8_4_ = fVar199;
                auVar156._12_4_ = fVar199;
                auVar79 = vfmadd132ps_fma(auVar156,auVar185,local_4f0);
                auVar170._4_4_ = fVar198;
                auVar170._0_4_ = fVar198;
                auVar170._8_4_ = fVar198;
                auVar170._12_4_ = fVar198;
                auVar79 = vfmadd132ps_fma(auVar170,auVar79,local_4e0);
                auVar157._4_4_ = fVar197;
                auVar157._0_4_ = fVar197;
                auVar157._8_4_ = fVar197;
                auVar157._12_4_ = fVar197;
                auVar183 = ZEXT464((uint)*(float *)(local_180 + uVar56 * 4));
                (ray->super_RayK<1>).tfar = *(float *)(local_180 + uVar56 * 4);
                auVar79 = vfmadd132ps_fma(auVar157,auVar79,local_4c0);
                uVar147 = vmovlps_avx(auVar79);
                *(undefined8 *)&(ray->Ng).field_0 = uVar147;
                fVar197 = (float)vextractps_avx(auVar79,2);
                (ray->Ng).field_0.field_0.z = fVar197;
                ray->u = fVar155;
                ray->v = fVar196;
                ray->primID = uVar58;
                ray->geomID = uVar65;
                ray->instID[0] = local_540->user->instID[0];
                ray->instPrimID[0] = local_540->user->instPrimID[0];
                prim = local_530;
                context = local_540;
              }
            }
          }
        }
      }
    }
LAB_01919b16:
    if (8 < iVar8) {
      auVar103 = vpbroadcastd_avx512vl();
      auVar218 = ZEXT3264(auVar103);
      auVar103 = vbroadcastss_avx512vl(ZEXT416((uint)local_3e0._0_4_));
      auVar217 = ZEXT3264(auVar103);
      auVar143._8_4_ = 3;
      auVar143._0_8_ = 0x300000003;
      auVar143._12_4_ = 3;
      auVar143._16_4_ = 3;
      auVar143._20_4_ = 3;
      auVar143._24_4_ = 3;
      auVar143._28_4_ = 3;
      local_3a0 = vpermps_avx2(auVar143,local_3a0);
      local_3c0._4_4_ = 1.0 / (float)local_400._0_4_;
      local_3c0._0_4_ = local_3c0._4_4_;
      fStack_3b8 = (float)local_3c0._4_4_;
      fStack_3b4 = (float)local_3c0._4_4_;
      fStack_3b0 = (float)local_3c0._4_4_;
      fStack_3ac = (float)local_3c0._4_4_;
      fStack_3a8 = (float)local_3c0._4_4_;
      fStack_3a4 = (float)local_3c0._4_4_;
      lVar59 = 8;
      local_440 = auVar99;
      local_460 = auVar95;
LAB_01919b97:
      if (lVar59 < lVar62) {
        auVar99 = vpbroadcastd_avx512vl();
        auVar99 = vpor_avx2(auVar99,_DAT_01fb4ba0);
        uVar21 = vpcmpgtd_avx512vl(auVar218._0_32_,auVar99);
        auVar99 = *(undefined1 (*) [32])(bezier_basis0 + lVar59 * 4 + lVar63);
        auVar103 = *(undefined1 (*) [32])(lVar63 + 0x21fb768 + lVar59 * 4);
        auVar104 = *(undefined1 (*) [32])(lVar63 + 0x21fbbec + lVar59 * 4);
        auVar102 = *(undefined1 (*) [32])(lVar63 + 0x21fc070 + lVar59 * 4);
        auVar190._0_4_ = auVar102._0_4_ * (float)local_360._0_4_;
        auVar190._4_4_ = auVar102._4_4_ * (float)local_360._4_4_;
        auVar190._8_4_ = auVar102._8_4_ * fStack_358;
        auVar190._12_4_ = auVar102._12_4_ * fStack_354;
        auVar190._16_4_ = auVar102._16_4_ * fStack_350;
        auVar190._20_4_ = auVar102._20_4_ * fStack_34c;
        auVar190._28_36_ = auVar189._28_36_;
        auVar190._24_4_ = auVar102._24_4_ * fStack_348;
        auVar189._0_4_ = auVar102._0_4_ * (float)local_380._0_4_;
        auVar189._4_4_ = auVar102._4_4_ * (float)local_380._4_4_;
        auVar189._8_4_ = auVar102._8_4_ * fStack_378;
        auVar189._12_4_ = auVar102._12_4_ * fStack_374;
        auVar189._16_4_ = auVar102._16_4_ * fStack_370;
        auVar189._20_4_ = auVar102._20_4_ * fStack_36c;
        auVar189._28_36_ = auVar183._28_36_;
        auVar189._24_4_ = auVar102._24_4_ * fStack_368;
        auVar101 = vmulps_avx512vl(local_e0,auVar102);
        auVar87 = vfmadd231ps_avx512vl(auVar190._0_32_,auVar104,local_320);
        auVar88 = vfmadd231ps_avx512vl(auVar189._0_32_,auVar104,local_340);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar104,local_c0);
        auVar87 = vfmadd231ps_avx512vl(auVar87,auVar103,local_2e0);
        auVar88 = vfmadd231ps_avx512vl(auVar88,auVar103,local_300);
        auVar89 = vfmadd231ps_avx512vl(auVar101,auVar103,local_a0);
        auVar79 = vfmadd231ps_fma(auVar87,auVar99,local_2a0);
        auVar189 = ZEXT1664(auVar79);
        auVar82 = vfmadd231ps_fma(auVar88,auVar99,local_2c0);
        auVar183 = ZEXT1664(auVar82);
        auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar59 * 4 + lVar63);
        auVar87 = *(undefined1 (*) [32])(lVar63 + 0x21fdb88 + lVar59 * 4);
        auVar91 = vfmadd231ps_avx512vl(auVar89,auVar99,local_80);
        auVar88 = *(undefined1 (*) [32])(lVar63 + 0x21fe00c + lVar59 * 4);
        auVar89 = *(undefined1 (*) [32])(lVar63 + 0x21fe490 + lVar59 * 4);
        auVar193._0_4_ = auVar89._0_4_ * (float)local_360._0_4_;
        auVar193._4_4_ = auVar89._4_4_ * (float)local_360._4_4_;
        auVar193._8_4_ = auVar89._8_4_ * fStack_358;
        auVar193._12_4_ = auVar89._12_4_ * fStack_354;
        auVar193._16_4_ = auVar89._16_4_ * fStack_350;
        auVar193._20_4_ = auVar89._20_4_ * fStack_34c;
        auVar193._28_36_ = auVar192._28_36_;
        auVar193._24_4_ = auVar89._24_4_ * fStack_348;
        auVar38._4_4_ = auVar89._4_4_ * (float)local_380._4_4_;
        auVar38._0_4_ = auVar89._0_4_ * (float)local_380._0_4_;
        auVar38._8_4_ = auVar89._8_4_ * fStack_378;
        auVar38._12_4_ = auVar89._12_4_ * fStack_374;
        auVar38._16_4_ = auVar89._16_4_ * fStack_370;
        auVar38._20_4_ = auVar89._20_4_ * fStack_36c;
        auVar38._24_4_ = auVar89._24_4_ * fStack_368;
        auVar38._28_4_ = uStack_364;
        auVar100 = vmulps_avx512vl(local_e0,auVar89);
        auVar90 = vfmadd231ps_avx512vl(auVar193._0_32_,auVar88,local_320);
        auVar92 = vfmadd231ps_avx512vl(auVar38,auVar88,local_340);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar88,local_c0);
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar87,local_2e0);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar87,local_300);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar87,local_a0);
        auVar81 = vfmadd231ps_fma(auVar90,auVar101,local_2a0);
        auVar192 = ZEXT1664(auVar81);
        auVar80 = vfmadd231ps_fma(auVar92,auVar101,local_2c0);
        auVar92 = vfmadd231ps_avx512vl(auVar100,auVar101,local_80);
        auVar93 = vmaxps_avx512vl(auVar91,auVar92);
        auVar100 = vsubps_avx(ZEXT1632(auVar81),ZEXT1632(auVar79));
        auVar90 = vsubps_avx(ZEXT1632(auVar80),ZEXT1632(auVar82));
        auVar94 = vmulps_avx512vl(ZEXT1632(auVar82),auVar100);
        auVar95 = vmulps_avx512vl(ZEXT1632(auVar79),auVar90);
        auVar94 = vsubps_avx512vl(auVar94,auVar95);
        auVar95 = vmulps_avx512vl(auVar90,auVar90);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar100,auVar100);
        auVar93 = vmulps_avx512vl(auVar93,auVar93);
        auVar93 = vmulps_avx512vl(auVar93,auVar95);
        auVar94 = vmulps_avx512vl(auVar94,auVar94);
        uVar147 = vcmpps_avx512vl(auVar94,auVar93,2);
        bVar64 = (byte)uVar21 & (byte)uVar147;
        if (bVar64 != 0) {
          auVar89 = vmulps_avx512vl(local_160,auVar89);
          auVar88 = vfmadd213ps_avx512vl(auVar88,local_140,auVar89);
          auVar87 = vfmadd213ps_avx512vl(auVar87,local_460,auVar88);
          auVar101 = vfmadd213ps_avx512vl(auVar101,local_440,auVar87);
          auVar102 = vmulps_avx512vl(local_160,auVar102);
          auVar104 = vfmadd213ps_avx512vl(auVar104,local_140,auVar102);
          auVar103 = vfmadd213ps_avx512vl(auVar103,local_460,auVar104);
          auVar87 = vfmadd213ps_avx512vl(auVar99,local_440,auVar103);
          auVar99 = *(undefined1 (*) [32])(lVar63 + 0x21fc4f4 + lVar59 * 4);
          auVar103 = *(undefined1 (*) [32])(lVar63 + 0x21fc978 + lVar59 * 4);
          auVar104 = *(undefined1 (*) [32])(lVar63 + 0x21fcdfc + lVar59 * 4);
          auVar102 = *(undefined1 (*) [32])(lVar63 + 0x21fd280 + lVar59 * 4);
          auVar88 = vmulps_avx512vl(_local_360,auVar102);
          auVar89 = vmulps_avx512vl(_local_380,auVar102);
          auVar102 = vmulps_avx512vl(local_160,auVar102);
          auVar88 = vfmadd231ps_avx512vl(auVar88,auVar104,local_320);
          auVar89 = vfmadd231ps_avx512vl(auVar89,auVar104,local_340);
          auVar104 = vfmadd231ps_avx512vl(auVar102,local_140,auVar104);
          auVar102 = vfmadd231ps_avx512vl(auVar88,auVar103,local_2e0);
          auVar88 = vfmadd231ps_avx512vl(auVar89,auVar103,local_300);
          auVar7 = vfmadd231ps_fma(auVar104,auVar103,local_460);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar99,local_2a0);
          auVar88 = vfmadd231ps_avx512vl(auVar88,auVar99,local_2c0);
          auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar99,local_440);
          auVar99 = *(undefined1 (*) [32])(lVar63 + 0x21fe914 + lVar59 * 4);
          auVar103 = *(undefined1 (*) [32])(lVar63 + 0x21ff21c + lVar59 * 4);
          auVar104 = *(undefined1 (*) [32])(lVar63 + 0x21ff6a0 + lVar59 * 4);
          auVar89 = vmulps_avx512vl(_local_360,auVar104);
          auVar93 = vmulps_avx512vl(_local_380,auVar104);
          auVar104 = vmulps_avx512vl(local_160,auVar104);
          auVar89 = vfmadd231ps_avx512vl(auVar89,auVar103,local_320);
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar103,local_340);
          auVar104 = vfmadd231ps_avx512vl(auVar104,local_140,auVar103);
          auVar103 = *(undefined1 (*) [32])(lVar63 + 0x21fed98 + lVar59 * 4);
          auVar89 = vfmadd231ps_avx512vl(auVar89,auVar103,local_2e0);
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar103,local_300);
          auVar103 = vfmadd231ps_avx512vl(auVar104,local_460,auVar103);
          auVar104 = vfmadd231ps_avx512vl(auVar89,auVar99,local_2a0);
          auVar89 = vfmadd231ps_avx512vl(auVar93,auVar99,local_2c0);
          auVar103 = vfmadd231ps_avx512vl(auVar103,local_440,auVar99);
          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar102,auVar93);
          vandps_avx512vl(auVar88,auVar93);
          auVar99 = vmaxps_avx(auVar93,auVar93);
          vandps_avx512vl(ZEXT1632(auVar7),auVar93);
          auVar99 = vmaxps_avx(auVar99,auVar93);
          auVar95 = auVar217._0_32_;
          uVar56 = vcmpps_avx512vl(auVar99,auVar95,1);
          bVar12 = (bool)((byte)uVar56 & 1);
          auVar118._0_4_ = (float)((uint)bVar12 * auVar100._0_4_ | (uint)!bVar12 * auVar102._0_4_);
          bVar12 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar118._4_4_ = (float)((uint)bVar12 * auVar100._4_4_ | (uint)!bVar12 * auVar102._4_4_);
          bVar12 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar118._8_4_ = (float)((uint)bVar12 * auVar100._8_4_ | (uint)!bVar12 * auVar102._8_4_);
          bVar12 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar118._12_4_ =
               (float)((uint)bVar12 * auVar100._12_4_ | (uint)!bVar12 * auVar102._12_4_);
          bVar12 = (bool)((byte)(uVar56 >> 4) & 1);
          auVar118._16_4_ =
               (float)((uint)bVar12 * auVar100._16_4_ | (uint)!bVar12 * auVar102._16_4_);
          bVar12 = (bool)((byte)(uVar56 >> 5) & 1);
          auVar118._20_4_ =
               (float)((uint)bVar12 * auVar100._20_4_ | (uint)!bVar12 * auVar102._20_4_);
          bVar12 = (bool)((byte)(uVar56 >> 6) & 1);
          auVar118._24_4_ =
               (float)((uint)bVar12 * auVar100._24_4_ | (uint)!bVar12 * auVar102._24_4_);
          bVar12 = SUB81(uVar56 >> 7,0);
          auVar118._28_4_ = (uint)bVar12 * auVar100._28_4_ | (uint)!bVar12 * auVar102._28_4_;
          bVar12 = (bool)((byte)uVar56 & 1);
          auVar119._0_4_ = (float)((uint)bVar12 * auVar90._0_4_ | (uint)!bVar12 * auVar88._0_4_);
          bVar12 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar119._4_4_ = (float)((uint)bVar12 * auVar90._4_4_ | (uint)!bVar12 * auVar88._4_4_);
          bVar12 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar119._8_4_ = (float)((uint)bVar12 * auVar90._8_4_ | (uint)!bVar12 * auVar88._8_4_);
          bVar12 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar119._12_4_ = (float)((uint)bVar12 * auVar90._12_4_ | (uint)!bVar12 * auVar88._12_4_);
          bVar12 = (bool)((byte)(uVar56 >> 4) & 1);
          auVar119._16_4_ = (float)((uint)bVar12 * auVar90._16_4_ | (uint)!bVar12 * auVar88._16_4_);
          bVar12 = (bool)((byte)(uVar56 >> 5) & 1);
          auVar119._20_4_ = (float)((uint)bVar12 * auVar90._20_4_ | (uint)!bVar12 * auVar88._20_4_);
          bVar12 = (bool)((byte)(uVar56 >> 6) & 1);
          auVar119._24_4_ = (float)((uint)bVar12 * auVar90._24_4_ | (uint)!bVar12 * auVar88._24_4_);
          bVar12 = SUB81(uVar56 >> 7,0);
          auVar119._28_4_ = (uint)bVar12 * auVar90._28_4_ | (uint)!bVar12 * auVar88._28_4_;
          vandps_avx512vl(auVar104,auVar93);
          vandps_avx512vl(auVar89,auVar93);
          auVar99 = vmaxps_avx(auVar119,auVar119);
          vandps_avx512vl(auVar103,auVar93);
          auVar99 = vmaxps_avx(auVar99,auVar119);
          uVar56 = vcmpps_avx512vl(auVar99,auVar95,1);
          bVar12 = (bool)((byte)uVar56 & 1);
          auVar120._0_4_ = (uint)bVar12 * auVar100._0_4_ | (uint)!bVar12 * auVar104._0_4_;
          bVar12 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar120._4_4_ = (uint)bVar12 * auVar100._4_4_ | (uint)!bVar12 * auVar104._4_4_;
          bVar12 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar120._8_4_ = (uint)bVar12 * auVar100._8_4_ | (uint)!bVar12 * auVar104._8_4_;
          bVar12 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar120._12_4_ = (uint)bVar12 * auVar100._12_4_ | (uint)!bVar12 * auVar104._12_4_;
          bVar12 = (bool)((byte)(uVar56 >> 4) & 1);
          auVar120._16_4_ = (uint)bVar12 * auVar100._16_4_ | (uint)!bVar12 * auVar104._16_4_;
          bVar12 = (bool)((byte)(uVar56 >> 5) & 1);
          auVar120._20_4_ = (uint)bVar12 * auVar100._20_4_ | (uint)!bVar12 * auVar104._20_4_;
          bVar12 = (bool)((byte)(uVar56 >> 6) & 1);
          auVar120._24_4_ = (uint)bVar12 * auVar100._24_4_ | (uint)!bVar12 * auVar104._24_4_;
          bVar12 = SUB81(uVar56 >> 7,0);
          auVar120._28_4_ = (uint)bVar12 * auVar100._28_4_ | (uint)!bVar12 * auVar104._28_4_;
          bVar12 = (bool)((byte)uVar56 & 1);
          auVar121._0_4_ = (float)((uint)bVar12 * auVar90._0_4_ | (uint)!bVar12 * auVar89._0_4_);
          bVar12 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar121._4_4_ = (float)((uint)bVar12 * auVar90._4_4_ | (uint)!bVar12 * auVar89._4_4_);
          bVar12 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar121._8_4_ = (float)((uint)bVar12 * auVar90._8_4_ | (uint)!bVar12 * auVar89._8_4_);
          bVar12 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar121._12_4_ = (float)((uint)bVar12 * auVar90._12_4_ | (uint)!bVar12 * auVar89._12_4_);
          bVar12 = (bool)((byte)(uVar56 >> 4) & 1);
          auVar121._16_4_ = (float)((uint)bVar12 * auVar90._16_4_ | (uint)!bVar12 * auVar89._16_4_);
          bVar12 = (bool)((byte)(uVar56 >> 5) & 1);
          auVar121._20_4_ = (float)((uint)bVar12 * auVar90._20_4_ | (uint)!bVar12 * auVar89._20_4_);
          bVar12 = (bool)((byte)(uVar56 >> 6) & 1);
          auVar121._24_4_ = (float)((uint)bVar12 * auVar90._24_4_ | (uint)!bVar12 * auVar89._24_4_);
          bVar12 = SUB81(uVar56 >> 7,0);
          auVar121._28_4_ = (uint)bVar12 * auVar90._28_4_ | (uint)!bVar12 * auVar89._28_4_;
          auVar202._8_4_ = 0x80000000;
          auVar202._0_8_ = 0x8000000080000000;
          auVar202._12_4_ = 0x80000000;
          auVar202._16_4_ = 0x80000000;
          auVar202._20_4_ = 0x80000000;
          auVar202._24_4_ = 0x80000000;
          auVar202._28_4_ = 0x80000000;
          auVar99 = vxorps_avx512vl(auVar120,auVar202);
          auVar78 = vxorps_avx512vl(auVar93._0_16_,auVar93._0_16_);
          auVar103 = vfmadd213ps_avx512vl(auVar118,auVar118,ZEXT1632(auVar78));
          auVar7 = vfmadd231ps_fma(auVar103,auVar119,auVar119);
          auVar103 = vrsqrt14ps_avx512vl(ZEXT1632(auVar7));
          auVar216._8_4_ = 0xbf000000;
          auVar216._0_8_ = 0xbf000000bf000000;
          auVar216._12_4_ = 0xbf000000;
          auVar216._16_4_ = 0xbf000000;
          auVar216._20_4_ = 0xbf000000;
          auVar216._24_4_ = 0xbf000000;
          auVar216._28_4_ = 0xbf000000;
          fVar155 = auVar103._0_4_;
          fVar196 = auVar103._4_4_;
          fVar197 = auVar103._8_4_;
          fVar198 = auVar103._12_4_;
          fVar199 = auVar103._16_4_;
          fVar166 = auVar103._20_4_;
          fVar167 = auVar103._24_4_;
          auVar39._4_4_ = fVar196 * fVar196 * fVar196 * auVar7._4_4_ * -0.5;
          auVar39._0_4_ = fVar155 * fVar155 * fVar155 * auVar7._0_4_ * -0.5;
          auVar39._8_4_ = fVar197 * fVar197 * fVar197 * auVar7._8_4_ * -0.5;
          auVar39._12_4_ = fVar198 * fVar198 * fVar198 * auVar7._12_4_ * -0.5;
          auVar39._16_4_ = fVar199 * fVar199 * fVar199 * -0.0;
          auVar39._20_4_ = fVar166 * fVar166 * fVar166 * -0.0;
          auVar39._24_4_ = fVar167 * fVar167 * fVar167 * -0.0;
          auVar39._28_4_ = auVar119._28_4_;
          auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar103 = vfmadd231ps_avx512vl(auVar39,auVar104,auVar103);
          auVar40._4_4_ = auVar119._4_4_ * auVar103._4_4_;
          auVar40._0_4_ = auVar119._0_4_ * auVar103._0_4_;
          auVar40._8_4_ = auVar119._8_4_ * auVar103._8_4_;
          auVar40._12_4_ = auVar119._12_4_ * auVar103._12_4_;
          auVar40._16_4_ = auVar119._16_4_ * auVar103._16_4_;
          auVar40._20_4_ = auVar119._20_4_ * auVar103._20_4_;
          auVar40._24_4_ = auVar119._24_4_ * auVar103._24_4_;
          auVar40._28_4_ = 0;
          auVar41._4_4_ = auVar103._4_4_ * -auVar118._4_4_;
          auVar41._0_4_ = auVar103._0_4_ * -auVar118._0_4_;
          auVar41._8_4_ = auVar103._8_4_ * -auVar118._8_4_;
          auVar41._12_4_ = auVar103._12_4_ * -auVar118._12_4_;
          auVar41._16_4_ = auVar103._16_4_ * -auVar118._16_4_;
          auVar41._20_4_ = auVar103._20_4_ * -auVar118._20_4_;
          auVar41._24_4_ = auVar103._24_4_ * -auVar118._24_4_;
          auVar41._28_4_ = auVar119._28_4_;
          auVar102 = vmulps_avx512vl(auVar103,ZEXT1632(auVar78));
          auVar89 = ZEXT1632(auVar78);
          auVar103 = vfmadd213ps_avx512vl(auVar120,auVar120,auVar89);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar121,auVar121);
          auVar88 = vrsqrt14ps_avx512vl(auVar103);
          auVar103 = vmulps_avx512vl(auVar103,auVar216);
          fVar155 = auVar88._0_4_;
          fVar196 = auVar88._4_4_;
          fVar197 = auVar88._8_4_;
          fVar198 = auVar88._12_4_;
          fVar199 = auVar88._16_4_;
          fVar166 = auVar88._20_4_;
          fVar167 = auVar88._24_4_;
          auVar42._4_4_ = fVar196 * fVar196 * fVar196 * auVar103._4_4_;
          auVar42._0_4_ = fVar155 * fVar155 * fVar155 * auVar103._0_4_;
          auVar42._8_4_ = fVar197 * fVar197 * fVar197 * auVar103._8_4_;
          auVar42._12_4_ = fVar198 * fVar198 * fVar198 * auVar103._12_4_;
          auVar42._16_4_ = fVar199 * fVar199 * fVar199 * auVar103._16_4_;
          auVar42._20_4_ = fVar166 * fVar166 * fVar166 * auVar103._20_4_;
          auVar42._24_4_ = fVar167 * fVar167 * fVar167 * auVar103._24_4_;
          auVar42._28_4_ = auVar103._28_4_;
          auVar103 = vfmadd231ps_avx512vl(auVar42,auVar104,auVar88);
          auVar43._4_4_ = auVar121._4_4_ * auVar103._4_4_;
          auVar43._0_4_ = auVar121._0_4_ * auVar103._0_4_;
          auVar43._8_4_ = auVar121._8_4_ * auVar103._8_4_;
          auVar43._12_4_ = auVar121._12_4_ * auVar103._12_4_;
          auVar43._16_4_ = auVar121._16_4_ * auVar103._16_4_;
          auVar43._20_4_ = auVar121._20_4_ * auVar103._20_4_;
          auVar43._24_4_ = auVar121._24_4_ * auVar103._24_4_;
          auVar43._28_4_ = auVar88._28_4_;
          auVar44._4_4_ = auVar103._4_4_ * auVar99._4_4_;
          auVar44._0_4_ = auVar103._0_4_ * auVar99._0_4_;
          auVar44._8_4_ = auVar103._8_4_ * auVar99._8_4_;
          auVar44._12_4_ = auVar103._12_4_ * auVar99._12_4_;
          auVar44._16_4_ = auVar103._16_4_ * auVar99._16_4_;
          auVar44._20_4_ = auVar103._20_4_ * auVar99._20_4_;
          auVar44._24_4_ = auVar103._24_4_ * auVar99._24_4_;
          auVar44._28_4_ = auVar99._28_4_;
          auVar99 = vmulps_avx512vl(auVar103,auVar89);
          auVar7 = vfmadd213ps_fma(auVar40,auVar91,ZEXT1632(auVar79));
          auVar18 = vfmadd213ps_fma(auVar41,auVar91,ZEXT1632(auVar82));
          auVar104 = vfmadd213ps_avx512vl(auVar102,auVar91,auVar87);
          auVar88 = vfmadd213ps_avx512vl(auVar43,auVar92,ZEXT1632(auVar81));
          auVar71 = vfnmadd213ps_fma(auVar40,auVar91,ZEXT1632(auVar79));
          auVar79 = vfmadd213ps_fma(auVar44,auVar92,ZEXT1632(auVar80));
          auVar72 = vfnmadd213ps_fma(auVar41,auVar91,ZEXT1632(auVar82));
          auVar82 = vfmadd213ps_fma(auVar99,auVar92,auVar101);
          auVar76 = vfnmadd231ps_fma(auVar87,auVar91,auVar102);
          auVar73 = vfnmadd213ps_fma(auVar43,auVar92,ZEXT1632(auVar81));
          auVar74 = vfnmadd213ps_fma(auVar44,auVar92,ZEXT1632(auVar80));
          auVar77 = vfnmadd231ps_fma(auVar101,auVar92,auVar99);
          auVar101 = vsubps_avx512vl(auVar88,ZEXT1632(auVar71));
          auVar99 = vsubps_avx(ZEXT1632(auVar79),ZEXT1632(auVar72));
          auVar103 = vsubps_avx(ZEXT1632(auVar82),ZEXT1632(auVar76));
          auVar45._4_4_ = auVar99._4_4_ * auVar76._4_4_;
          auVar45._0_4_ = auVar99._0_4_ * auVar76._0_4_;
          auVar45._8_4_ = auVar99._8_4_ * auVar76._8_4_;
          auVar45._12_4_ = auVar99._12_4_ * auVar76._12_4_;
          auVar45._16_4_ = auVar99._16_4_ * 0.0;
          auVar45._20_4_ = auVar99._20_4_ * 0.0;
          auVar45._24_4_ = auVar99._24_4_ * 0.0;
          auVar45._28_4_ = auVar102._28_4_;
          auVar81 = vfmsub231ps_fma(auVar45,ZEXT1632(auVar72),auVar103);
          auVar46._4_4_ = auVar103._4_4_ * auVar71._4_4_;
          auVar46._0_4_ = auVar103._0_4_ * auVar71._0_4_;
          auVar46._8_4_ = auVar103._8_4_ * auVar71._8_4_;
          auVar46._12_4_ = auVar103._12_4_ * auVar71._12_4_;
          auVar46._16_4_ = auVar103._16_4_ * 0.0;
          auVar46._20_4_ = auVar103._20_4_ * 0.0;
          auVar46._24_4_ = auVar103._24_4_ * 0.0;
          auVar46._28_4_ = auVar103._28_4_;
          auVar80 = vfmsub231ps_fma(auVar46,ZEXT1632(auVar76),auVar101);
          auVar47._4_4_ = auVar72._4_4_ * auVar101._4_4_;
          auVar47._0_4_ = auVar72._0_4_ * auVar101._0_4_;
          auVar47._8_4_ = auVar72._8_4_ * auVar101._8_4_;
          auVar47._12_4_ = auVar72._12_4_ * auVar101._12_4_;
          auVar47._16_4_ = auVar101._16_4_ * 0.0;
          auVar47._20_4_ = auVar101._20_4_ * 0.0;
          auVar47._24_4_ = auVar101._24_4_ * 0.0;
          auVar47._28_4_ = auVar101._28_4_;
          auVar75 = vfmsub231ps_fma(auVar47,ZEXT1632(auVar71),auVar99);
          auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar75),auVar89,ZEXT1632(auVar80));
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar89,ZEXT1632(auVar81));
          auVar94 = ZEXT1632(auVar78);
          uVar56 = vcmpps_avx512vl(auVar99,auVar94,2);
          bVar55 = (byte)uVar56;
          fVar67 = (float)((uint)(bVar55 & 1) * auVar7._0_4_ |
                          (uint)!(bool)(bVar55 & 1) * auVar73._0_4_);
          bVar12 = (bool)((byte)(uVar56 >> 1) & 1);
          fVar131 = (float)((uint)bVar12 * auVar7._4_4_ | (uint)!bVar12 * auVar73._4_4_);
          bVar12 = (bool)((byte)(uVar56 >> 2) & 1);
          fVar132 = (float)((uint)bVar12 * auVar7._8_4_ | (uint)!bVar12 * auVar73._8_4_);
          bVar12 = (bool)((byte)(uVar56 >> 3) & 1);
          fVar135 = (float)((uint)bVar12 * auVar7._12_4_ | (uint)!bVar12 * auVar73._12_4_);
          auVar89 = ZEXT1632(CONCAT412(fVar135,CONCAT48(fVar132,CONCAT44(fVar131,fVar67))));
          fVar130 = (float)((uint)(bVar55 & 1) * auVar18._0_4_ |
                           (uint)!(bool)(bVar55 & 1) * auVar74._0_4_);
          bVar12 = (bool)((byte)(uVar56 >> 1) & 1);
          fVar134 = (float)((uint)bVar12 * auVar18._4_4_ | (uint)!bVar12 * auVar74._4_4_);
          bVar12 = (bool)((byte)(uVar56 >> 2) & 1);
          fVar133 = (float)((uint)bVar12 * auVar18._8_4_ | (uint)!bVar12 * auVar74._8_4_);
          bVar12 = (bool)((byte)(uVar56 >> 3) & 1);
          fVar136 = (float)((uint)bVar12 * auVar18._12_4_ | (uint)!bVar12 * auVar74._12_4_);
          auVar100 = ZEXT1632(CONCAT412(fVar136,CONCAT48(fVar133,CONCAT44(fVar134,fVar130))));
          auVar122._0_4_ =
               (float)((uint)(bVar55 & 1) * auVar104._0_4_ |
                      (uint)!(bool)(bVar55 & 1) * auVar77._0_4_);
          bVar12 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar122._4_4_ = (float)((uint)bVar12 * auVar104._4_4_ | (uint)!bVar12 * auVar77._4_4_);
          bVar12 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar122._8_4_ = (float)((uint)bVar12 * auVar104._8_4_ | (uint)!bVar12 * auVar77._8_4_);
          bVar12 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar122._12_4_ = (float)((uint)bVar12 * auVar104._12_4_ | (uint)!bVar12 * auVar77._12_4_)
          ;
          fVar197 = (float)((uint)((byte)(uVar56 >> 4) & 1) * auVar104._16_4_);
          auVar122._16_4_ = fVar197;
          fVar155 = (float)((uint)((byte)(uVar56 >> 5) & 1) * auVar104._20_4_);
          auVar122._20_4_ = fVar155;
          fVar196 = (float)((uint)((byte)(uVar56 >> 6) & 1) * auVar104._24_4_);
          auVar122._24_4_ = fVar196;
          iVar1 = (uint)(byte)(uVar56 >> 7) * auVar104._28_4_;
          auVar122._28_4_ = iVar1;
          auVar99 = vblendmps_avx512vl(ZEXT1632(auVar71),auVar88);
          auVar123._0_4_ =
               (uint)(bVar55 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar81._0_4_;
          bVar12 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar123._4_4_ = (uint)bVar12 * auVar99._4_4_ | (uint)!bVar12 * auVar81._4_4_;
          bVar12 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar123._8_4_ = (uint)bVar12 * auVar99._8_4_ | (uint)!bVar12 * auVar81._8_4_;
          bVar12 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar123._12_4_ = (uint)bVar12 * auVar99._12_4_ | (uint)!bVar12 * auVar81._12_4_;
          auVar123._16_4_ = (uint)((byte)(uVar56 >> 4) & 1) * auVar99._16_4_;
          auVar123._20_4_ = (uint)((byte)(uVar56 >> 5) & 1) * auVar99._20_4_;
          auVar123._24_4_ = (uint)((byte)(uVar56 >> 6) & 1) * auVar99._24_4_;
          auVar123._28_4_ = (uint)(byte)(uVar56 >> 7) * auVar99._28_4_;
          auVar99 = vblendmps_avx512vl(ZEXT1632(auVar72),ZEXT1632(auVar79));
          auVar124._0_4_ =
               (float)((uint)(bVar55 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar7._0_4_
                      );
          bVar12 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar124._4_4_ = (float)((uint)bVar12 * auVar99._4_4_ | (uint)!bVar12 * auVar7._4_4_);
          bVar12 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar124._8_4_ = (float)((uint)bVar12 * auVar99._8_4_ | (uint)!bVar12 * auVar7._8_4_);
          bVar12 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar124._12_4_ = (float)((uint)bVar12 * auVar99._12_4_ | (uint)!bVar12 * auVar7._12_4_);
          fVar166 = (float)((uint)((byte)(uVar56 >> 4) & 1) * auVar99._16_4_);
          auVar124._16_4_ = fVar166;
          fVar199 = (float)((uint)((byte)(uVar56 >> 5) & 1) * auVar99._20_4_);
          auVar124._20_4_ = fVar199;
          fVar198 = (float)((uint)((byte)(uVar56 >> 6) & 1) * auVar99._24_4_);
          auVar124._24_4_ = fVar198;
          auVar124._28_4_ = (uint)(byte)(uVar56 >> 7) * auVar99._28_4_;
          auVar99 = vblendmps_avx512vl(ZEXT1632(auVar76),ZEXT1632(auVar82));
          auVar125._0_4_ =
               (float)((uint)(bVar55 & 1) * auVar99._0_4_ |
                      (uint)!(bool)(bVar55 & 1) * auVar18._0_4_);
          bVar12 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar125._4_4_ = (float)((uint)bVar12 * auVar99._4_4_ | (uint)!bVar12 * auVar18._4_4_);
          bVar12 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar125._8_4_ = (float)((uint)bVar12 * auVar99._8_4_ | (uint)!bVar12 * auVar18._8_4_);
          bVar12 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar125._12_4_ = (float)((uint)bVar12 * auVar99._12_4_ | (uint)!bVar12 * auVar18._12_4_);
          fVar169 = (float)((uint)((byte)(uVar56 >> 4) & 1) * auVar99._16_4_);
          auVar125._16_4_ = fVar169;
          fVar168 = (float)((uint)((byte)(uVar56 >> 5) & 1) * auVar99._20_4_);
          auVar125._20_4_ = fVar168;
          fVar167 = (float)((uint)((byte)(uVar56 >> 6) & 1) * auVar99._24_4_);
          auVar125._24_4_ = fVar167;
          iVar2 = (uint)(byte)(uVar56 >> 7) * auVar99._28_4_;
          auVar125._28_4_ = iVar2;
          auVar126._0_4_ =
               (uint)(bVar55 & 1) * (int)auVar71._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar88._0_4_;
          bVar12 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar126._4_4_ = (uint)bVar12 * (int)auVar71._4_4_ | (uint)!bVar12 * auVar88._4_4_;
          bVar12 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar126._8_4_ = (uint)bVar12 * (int)auVar71._8_4_ | (uint)!bVar12 * auVar88._8_4_;
          bVar12 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar126._12_4_ = (uint)bVar12 * (int)auVar71._12_4_ | (uint)!bVar12 * auVar88._12_4_;
          auVar126._16_4_ = (uint)!(bool)((byte)(uVar56 >> 4) & 1) * auVar88._16_4_;
          auVar126._20_4_ = (uint)!(bool)((byte)(uVar56 >> 5) & 1) * auVar88._20_4_;
          auVar126._24_4_ = (uint)!(bool)((byte)(uVar56 >> 6) & 1) * auVar88._24_4_;
          auVar126._28_4_ = (uint)!SUB81(uVar56 >> 7,0) * auVar88._28_4_;
          bVar12 = (bool)((byte)(uVar56 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar56 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar56 >> 3) & 1);
          bVar13 = (bool)((byte)(uVar56 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar56 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar88 = vsubps_avx512vl(auVar126,auVar89);
          auVar103 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar72._12_4_ |
                                                   (uint)!bVar16 * auVar79._12_4_,
                                                   CONCAT48((uint)bVar14 * (int)auVar72._8_4_ |
                                                            (uint)!bVar14 * auVar79._8_4_,
                                                            CONCAT44((uint)bVar12 *
                                                                     (int)auVar72._4_4_ |
                                                                     (uint)!bVar12 * auVar79._4_4_,
                                                                     (uint)(bVar55 & 1) *
                                                                     (int)auVar72._0_4_ |
                                                                     (uint)!(bool)(bVar55 & 1) *
                                                                     auVar79._0_4_)))),auVar100);
          auVar189 = ZEXT3264(auVar103);
          auVar104 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar76._12_4_ |
                                                   (uint)!bVar17 * auVar82._12_4_,
                                                   CONCAT48((uint)bVar15 * (int)auVar76._8_4_ |
                                                            (uint)!bVar15 * auVar82._8_4_,
                                                            CONCAT44((uint)bVar13 *
                                                                     (int)auVar76._4_4_ |
                                                                     (uint)!bVar13 * auVar82._4_4_,
                                                                     (uint)(bVar55 & 1) *
                                                                     (int)auVar76._0_4_ |
                                                                     (uint)!(bool)(bVar55 & 1) *
                                                                     auVar82._0_4_)))),auVar122);
          auVar102 = vsubps_avx(auVar89,auVar123);
          auVar192 = ZEXT3264(auVar102);
          auVar101 = vsubps_avx(auVar100,auVar124);
          auVar87 = vsubps_avx(auVar122,auVar125);
          auVar48._4_4_ = auVar104._4_4_ * fVar131;
          auVar48._0_4_ = auVar104._0_4_ * fVar67;
          auVar48._8_4_ = auVar104._8_4_ * fVar132;
          auVar48._12_4_ = auVar104._12_4_ * fVar135;
          auVar48._16_4_ = auVar104._16_4_ * 0.0;
          auVar48._20_4_ = auVar104._20_4_ * 0.0;
          auVar48._24_4_ = auVar104._24_4_ * 0.0;
          auVar48._28_4_ = 0;
          auVar79 = vfmsub231ps_fma(auVar48,auVar122,auVar88);
          auVar175._0_4_ = fVar130 * auVar88._0_4_;
          auVar175._4_4_ = fVar134 * auVar88._4_4_;
          auVar175._8_4_ = fVar133 * auVar88._8_4_;
          auVar175._12_4_ = fVar136 * auVar88._12_4_;
          auVar175._16_4_ = auVar88._16_4_ * 0.0;
          auVar175._20_4_ = auVar88._20_4_ * 0.0;
          auVar175._24_4_ = auVar88._24_4_ * 0.0;
          auVar175._28_4_ = 0;
          auVar82 = vfmsub231ps_fma(auVar175,auVar89,auVar103);
          auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar94,ZEXT1632(auVar79));
          auVar181._0_4_ = auVar103._0_4_ * auVar122._0_4_;
          auVar181._4_4_ = auVar103._4_4_ * auVar122._4_4_;
          auVar181._8_4_ = auVar103._8_4_ * auVar122._8_4_;
          auVar181._12_4_ = auVar103._12_4_ * auVar122._12_4_;
          auVar181._16_4_ = auVar103._16_4_ * fVar197;
          auVar181._20_4_ = auVar103._20_4_ * fVar155;
          auVar181._24_4_ = auVar103._24_4_ * fVar196;
          auVar181._28_4_ = 0;
          auVar79 = vfmsub231ps_fma(auVar181,auVar100,auVar104);
          auVar90 = vfmadd231ps_avx512vl(auVar99,auVar94,ZEXT1632(auVar79));
          auVar99 = vmulps_avx512vl(auVar87,auVar123);
          auVar99 = vfmsub231ps_avx512vl(auVar99,auVar102,auVar125);
          auVar49._4_4_ = auVar101._4_4_ * auVar125._4_4_;
          auVar49._0_4_ = auVar101._0_4_ * auVar125._0_4_;
          auVar49._8_4_ = auVar101._8_4_ * auVar125._8_4_;
          auVar49._12_4_ = auVar101._12_4_ * auVar125._12_4_;
          auVar49._16_4_ = auVar101._16_4_ * fVar169;
          auVar49._20_4_ = auVar101._20_4_ * fVar168;
          auVar49._24_4_ = auVar101._24_4_ * fVar167;
          auVar49._28_4_ = iVar2;
          auVar79 = vfmsub231ps_fma(auVar49,auVar124,auVar87);
          auVar182._0_4_ = auVar124._0_4_ * auVar102._0_4_;
          auVar182._4_4_ = auVar124._4_4_ * auVar102._4_4_;
          auVar182._8_4_ = auVar124._8_4_ * auVar102._8_4_;
          auVar182._12_4_ = auVar124._12_4_ * auVar102._12_4_;
          auVar182._16_4_ = fVar166 * auVar102._16_4_;
          auVar182._20_4_ = fVar199 * auVar102._20_4_;
          auVar182._24_4_ = fVar198 * auVar102._24_4_;
          auVar182._28_4_ = 0;
          auVar82 = vfmsub231ps_fma(auVar182,auVar101,auVar123);
          auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar94,auVar99);
          auVar93 = vfmadd231ps_avx512vl(auVar99,auVar94,ZEXT1632(auVar79));
          auVar183 = ZEXT3264(auVar93);
          auVar99 = vmaxps_avx(auVar90,auVar93);
          uVar147 = vcmpps_avx512vl(auVar99,auVar94,2);
          bVar64 = bVar64 & (byte)uVar147;
          if (bVar64 != 0) {
            auVar50._4_4_ = auVar87._4_4_ * auVar103._4_4_;
            auVar50._0_4_ = auVar87._0_4_ * auVar103._0_4_;
            auVar50._8_4_ = auVar87._8_4_ * auVar103._8_4_;
            auVar50._12_4_ = auVar87._12_4_ * auVar103._12_4_;
            auVar50._16_4_ = auVar87._16_4_ * auVar103._16_4_;
            auVar50._20_4_ = auVar87._20_4_ * auVar103._20_4_;
            auVar50._24_4_ = auVar87._24_4_ * auVar103._24_4_;
            auVar50._28_4_ = auVar99._28_4_;
            auVar80 = vfmsub231ps_fma(auVar50,auVar101,auVar104);
            auVar51._4_4_ = auVar104._4_4_ * auVar102._4_4_;
            auVar51._0_4_ = auVar104._0_4_ * auVar102._0_4_;
            auVar51._8_4_ = auVar104._8_4_ * auVar102._8_4_;
            auVar51._12_4_ = auVar104._12_4_ * auVar102._12_4_;
            auVar51._16_4_ = auVar104._16_4_ * auVar102._16_4_;
            auVar51._20_4_ = auVar104._20_4_ * auVar102._20_4_;
            auVar51._24_4_ = auVar104._24_4_ * auVar102._24_4_;
            auVar51._28_4_ = auVar104._28_4_;
            auVar81 = vfmsub231ps_fma(auVar51,auVar88,auVar87);
            auVar52._4_4_ = auVar101._4_4_ * auVar88._4_4_;
            auVar52._0_4_ = auVar101._0_4_ * auVar88._0_4_;
            auVar52._8_4_ = auVar101._8_4_ * auVar88._8_4_;
            auVar52._12_4_ = auVar101._12_4_ * auVar88._12_4_;
            auVar52._16_4_ = auVar101._16_4_ * auVar88._16_4_;
            auVar52._20_4_ = auVar101._20_4_ * auVar88._20_4_;
            auVar52._24_4_ = auVar101._24_4_ * auVar88._24_4_;
            auVar52._28_4_ = auVar101._28_4_;
            auVar7 = vfmsub231ps_fma(auVar52,auVar102,auVar103);
            auVar79 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar81),ZEXT1632(auVar7));
            auVar82 = vfmadd231ps_fma(ZEXT1632(auVar79),ZEXT1632(auVar80),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar99 = vrcp14ps_avx512vl(ZEXT1632(auVar82));
            auVar27._8_4_ = 0x3f800000;
            auVar27._0_8_ = 0x3f8000003f800000;
            auVar27._12_4_ = 0x3f800000;
            auVar27._16_4_ = 0x3f800000;
            auVar27._20_4_ = 0x3f800000;
            auVar27._24_4_ = 0x3f800000;
            auVar27._28_4_ = 0x3f800000;
            auVar103 = vfnmadd213ps_avx512vl(auVar99,ZEXT1632(auVar82),auVar27);
            auVar79 = vfmadd132ps_fma(auVar103,auVar99,auVar99);
            auVar189 = ZEXT1664(auVar79);
            auVar53._4_4_ = auVar7._4_4_ * auVar122._4_4_;
            auVar53._0_4_ = auVar7._0_4_ * auVar122._0_4_;
            auVar53._8_4_ = auVar7._8_4_ * auVar122._8_4_;
            auVar53._12_4_ = auVar7._12_4_ * auVar122._12_4_;
            auVar53._16_4_ = fVar197 * 0.0;
            auVar53._20_4_ = fVar155 * 0.0;
            auVar53._24_4_ = fVar196 * 0.0;
            auVar53._28_4_ = iVar1;
            auVar81 = vfmadd231ps_fma(auVar53,auVar100,ZEXT1632(auVar81));
            auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar89,ZEXT1632(auVar80));
            fVar196 = auVar79._0_4_;
            fVar197 = auVar79._4_4_;
            fVar198 = auVar79._8_4_;
            fVar199 = auVar79._12_4_;
            local_240._28_4_ = auVar99._28_4_;
            local_240._0_28_ =
                 ZEXT1628(CONCAT412(auVar81._12_4_ * fVar199,
                                    CONCAT48(auVar81._8_4_ * fVar198,
                                             CONCAT44(auVar81._4_4_ * fVar197,
                                                      auVar81._0_4_ * fVar196))));
            auVar192 = ZEXT3264(local_240);
            uVar147 = vcmpps_avx512vl(local_240,local_3a0,0xd);
            fVar155 = (ray->super_RayK<1>).tfar;
            auVar28._4_4_ = fVar155;
            auVar28._0_4_ = fVar155;
            auVar28._8_4_ = fVar155;
            auVar28._12_4_ = fVar155;
            auVar28._16_4_ = fVar155;
            auVar28._20_4_ = fVar155;
            auVar28._24_4_ = fVar155;
            auVar28._28_4_ = fVar155;
            uVar21 = vcmpps_avx512vl(local_240,auVar28,2);
            bVar64 = (byte)uVar147 & (byte)uVar21 & bVar64;
            if (bVar64 != 0) {
              uVar66 = vcmpps_avx512vl(ZEXT1632(auVar82),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar66 = bVar64 & uVar66;
              if ((char)uVar66 != '\0') {
                fVar155 = auVar90._0_4_ * fVar196;
                fVar166 = auVar90._4_4_ * fVar197;
                auVar54._4_4_ = fVar166;
                auVar54._0_4_ = fVar155;
                fVar167 = auVar90._8_4_ * fVar198;
                auVar54._8_4_ = fVar167;
                fVar168 = auVar90._12_4_ * fVar199;
                auVar54._12_4_ = fVar168;
                fVar169 = auVar90._16_4_ * 0.0;
                auVar54._16_4_ = fVar169;
                fVar67 = auVar90._20_4_ * 0.0;
                auVar54._20_4_ = fVar67;
                fVar130 = auVar90._24_4_ * 0.0;
                auVar54._24_4_ = fVar130;
                auVar54._28_4_ = auVar90._28_4_;
                auVar165._8_4_ = 0x3f800000;
                auVar165._0_8_ = 0x3f8000003f800000;
                auVar165._12_4_ = 0x3f800000;
                auVar165._16_4_ = 0x3f800000;
                auVar165._20_4_ = 0x3f800000;
                auVar165._24_4_ = 0x3f800000;
                auVar165._28_4_ = 0x3f800000;
                auVar99 = vsubps_avx(auVar165,auVar54);
                local_280._0_4_ =
                     (float)((uint)(bVar55 & 1) * (int)fVar155 |
                            (uint)!(bool)(bVar55 & 1) * auVar99._0_4_);
                bVar12 = (bool)((byte)(uVar56 >> 1) & 1);
                local_280._4_4_ =
                     (float)((uint)bVar12 * (int)fVar166 | (uint)!bVar12 * auVar99._4_4_);
                bVar12 = (bool)((byte)(uVar56 >> 2) & 1);
                local_280._8_4_ =
                     (float)((uint)bVar12 * (int)fVar167 | (uint)!bVar12 * auVar99._8_4_);
                bVar12 = (bool)((byte)(uVar56 >> 3) & 1);
                local_280._12_4_ =
                     (float)((uint)bVar12 * (int)fVar168 | (uint)!bVar12 * auVar99._12_4_);
                bVar12 = (bool)((byte)(uVar56 >> 4) & 1);
                local_280._16_4_ =
                     (float)((uint)bVar12 * (int)fVar169 | (uint)!bVar12 * auVar99._16_4_);
                bVar12 = (bool)((byte)(uVar56 >> 5) & 1);
                local_280._20_4_ =
                     (float)((uint)bVar12 * (int)fVar67 | (uint)!bVar12 * auVar99._20_4_);
                bVar12 = (bool)((byte)(uVar56 >> 6) & 1);
                local_280._24_4_ =
                     (float)((uint)bVar12 * (int)fVar130 | (uint)!bVar12 * auVar99._24_4_);
                bVar12 = SUB81(uVar56 >> 7,0);
                local_280._28_4_ =
                     (float)((uint)bVar12 * auVar90._28_4_ | (uint)!bVar12 * auVar99._28_4_);
                auVar99 = vsubps_avx(auVar92,auVar91);
                auVar79 = vfmadd213ps_fma(auVar99,local_280,auVar91);
                fVar155 = local_528->depth_scale;
                auVar29._4_4_ = fVar155;
                auVar29._0_4_ = fVar155;
                auVar29._8_4_ = fVar155;
                auVar29._12_4_ = fVar155;
                auVar29._16_4_ = fVar155;
                auVar29._20_4_ = fVar155;
                auVar29._24_4_ = fVar155;
                auVar29._28_4_ = fVar155;
                auVar99 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar79._12_4_ + auVar79._12_4_,
                                                             CONCAT48(auVar79._8_4_ + auVar79._8_4_,
                                                                      CONCAT44(auVar79._4_4_ +
                                                                               auVar79._4_4_,
                                                                               auVar79._0_4_ +
                                                                               auVar79._0_4_)))),
                                          auVar29);
                uVar20 = vcmpps_avx512vl(local_240,auVar99,6);
                uVar66 = uVar66 & uVar20;
                bVar64 = (byte)uVar66;
                if (bVar64 != 0) {
                  auVar154._0_4_ = auVar93._0_4_ * fVar196;
                  auVar154._4_4_ = auVar93._4_4_ * fVar197;
                  auVar154._8_4_ = auVar93._8_4_ * fVar198;
                  auVar154._12_4_ = auVar93._12_4_ * fVar199;
                  auVar154._16_4_ = auVar93._16_4_ * 0.0;
                  auVar154._20_4_ = auVar93._20_4_ * 0.0;
                  auVar154._24_4_ = auVar93._24_4_ * 0.0;
                  auVar154._28_4_ = 0;
                  auVar176._8_4_ = 0x3f800000;
                  auVar176._0_8_ = 0x3f8000003f800000;
                  auVar176._12_4_ = 0x3f800000;
                  auVar176._16_4_ = 0x3f800000;
                  auVar176._20_4_ = 0x3f800000;
                  auVar176._24_4_ = 0x3f800000;
                  auVar176._28_4_ = 0x3f800000;
                  auVar99 = vsubps_avx(auVar176,auVar154);
                  auVar127._0_4_ =
                       (uint)(bVar55 & 1) * (int)auVar154._0_4_ |
                       (uint)!(bool)(bVar55 & 1) * auVar99._0_4_;
                  bVar12 = (bool)((byte)(uVar56 >> 1) & 1);
                  auVar127._4_4_ =
                       (uint)bVar12 * (int)auVar154._4_4_ | (uint)!bVar12 * auVar99._4_4_;
                  bVar12 = (bool)((byte)(uVar56 >> 2) & 1);
                  auVar127._8_4_ =
                       (uint)bVar12 * (int)auVar154._8_4_ | (uint)!bVar12 * auVar99._8_4_;
                  bVar12 = (bool)((byte)(uVar56 >> 3) & 1);
                  auVar127._12_4_ =
                       (uint)bVar12 * (int)auVar154._12_4_ | (uint)!bVar12 * auVar99._12_4_;
                  bVar12 = (bool)((byte)(uVar56 >> 4) & 1);
                  auVar127._16_4_ =
                       (uint)bVar12 * (int)auVar154._16_4_ | (uint)!bVar12 * auVar99._16_4_;
                  bVar12 = (bool)((byte)(uVar56 >> 5) & 1);
                  auVar127._20_4_ =
                       (uint)bVar12 * (int)auVar154._20_4_ | (uint)!bVar12 * auVar99._20_4_;
                  bVar12 = (bool)((byte)(uVar56 >> 6) & 1);
                  auVar127._24_4_ =
                       (uint)bVar12 * (int)auVar154._24_4_ | (uint)!bVar12 * auVar99._24_4_;
                  auVar127._28_4_ = (uint)!SUB81(uVar56 >> 7,0) * auVar99._28_4_;
                  auVar30._8_4_ = 0x40000000;
                  auVar30._0_8_ = 0x4000000040000000;
                  auVar30._12_4_ = 0x40000000;
                  auVar30._16_4_ = 0x40000000;
                  auVar30._20_4_ = 0x40000000;
                  auVar30._24_4_ = 0x40000000;
                  auVar30._28_4_ = 0x40000000;
                  local_260 = vfmsub132ps_avx512vl(auVar127,auVar176,auVar30);
                  local_220 = (int)lVar59;
                  local_21c = iVar8;
                  local_210 = local_4c0._0_8_;
                  uStack_208 = local_4c0._8_8_;
                  local_200 = local_4e0._0_8_;
                  uStack_1f8 = local_4e0._8_8_;
                  local_1f0 = local_4f0._0_8_;
                  uStack_1e8 = local_4f0._8_8_;
                  local_1e0 = local_4d0;
                  uStack_1d8 = uStack_4c8;
                  pGVar60 = (context->scene->geometries).items[local_550].ptr;
                  if ((pGVar60->mask & (ray->super_RayK<1>).mask) != 0) {
                    uVar65 = (uint)uVar66;
                    auVar79 = vcvtsi2ss_avx512f(auVar78,(int)lVar59);
                    fVar155 = auVar79._0_4_;
                    local_1c0[0] = (fVar155 + local_280._0_4_ + 0.0) * (float)local_3c0._0_4_;
                    local_1c0[1] = (fVar155 + local_280._4_4_ + 1.0) * (float)local_3c0._4_4_;
                    local_1c0[2] = (fVar155 + local_280._8_4_ + 2.0) * fStack_3b8;
                    local_1c0[3] = (fVar155 + local_280._12_4_ + 3.0) * fStack_3b4;
                    fStack_1b0 = (fVar155 + local_280._16_4_ + 4.0) * fStack_3b0;
                    fStack_1ac = (fVar155 + local_280._20_4_ + 5.0) * fStack_3ac;
                    fStack_1a8 = (fVar155 + local_280._24_4_ + 6.0) * fStack_3a8;
                    fStack_1a4 = fVar155 + local_280._28_4_ + 7.0;
                    local_1a0 = local_260;
                    local_180 = local_240;
                    auVar144._8_4_ = 0x7f800000;
                    auVar144._0_8_ = 0x7f8000007f800000;
                    auVar144._12_4_ = 0x7f800000;
                    auVar144._16_4_ = 0x7f800000;
                    auVar144._20_4_ = 0x7f800000;
                    auVar144._24_4_ = 0x7f800000;
                    auVar144._28_4_ = 0x7f800000;
                    auVar99 = vblendmps_avx512vl(auVar144,local_240);
                    auVar128._0_4_ =
                         (uint)(bVar64 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar64 & 1) * 0x7f800000
                    ;
                    bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
                    auVar128._4_4_ = (uint)bVar12 * auVar99._4_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
                    auVar128._8_4_ = (uint)bVar12 * auVar99._8_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
                    auVar128._12_4_ = (uint)bVar12 * auVar99._12_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar66 >> 4) & 1);
                    auVar128._16_4_ = (uint)bVar12 * auVar99._16_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar66 >> 5) & 1);
                    auVar128._20_4_ = (uint)bVar12 * auVar99._20_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar66 >> 6) & 1);
                    auVar128._24_4_ = (uint)bVar12 * auVar99._24_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = SUB81(uVar66 >> 7,0);
                    auVar128._28_4_ = (uint)bVar12 * auVar99._28_4_ | (uint)!bVar12 * 0x7f800000;
                    auVar99 = vshufps_avx(auVar128,auVar128,0xb1);
                    auVar99 = vminps_avx(auVar128,auVar99);
                    auVar103 = vshufpd_avx(auVar99,auVar99,5);
                    auVar99 = vminps_avx(auVar99,auVar103);
                    auVar103 = vpermpd_avx2(auVar99,0x4e);
                    auVar99 = vminps_avx(auVar99,auVar103);
                    uVar147 = vcmpps_avx512vl(auVar128,auVar99,0);
                    if ((bVar64 & (byte)uVar147) != 0) {
                      uVar65 = (uint)(bVar64 & (byte)uVar147);
                    }
                    uVar58 = 0;
                    for (; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x80000000) {
                      uVar58 = uVar58 + 1;
                    }
                    uVar56 = (ulong)uVar58;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar60->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_120 = auVar95;
                      local_100 = vmovdqa64_avx512vl(auVar218._0_32_);
                      local_468 = lVar62;
                      local_3e0 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                      local_400 = local_240;
                      local_420._0_8_ = pGVar60;
                      do {
                        local_4a4 = local_1c0[uVar56];
                        local_4a0 = *(undefined4 *)(local_1a0 + uVar56 * 4);
                        (ray->super_RayK<1>).tfar = *(float *)(local_180 + uVar56 * 4);
                        local_520.context = context->user;
                        fVar196 = 1.0 - local_4a4;
                        fVar155 = fVar196 * fVar196 * -3.0;
                        auVar183 = ZEXT464((uint)fVar155);
                        auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar196 * fVar196)),
                                                  ZEXT416((uint)(local_4a4 * fVar196)),
                                                  ZEXT416(0xc0000000));
                        auVar82 = vfmsub132ss_fma(ZEXT416((uint)(local_4a4 * fVar196)),
                                                  ZEXT416((uint)(local_4a4 * local_4a4)),
                                                  ZEXT416(0x40000000));
                        fVar196 = auVar79._0_4_ * 3.0;
                        fVar197 = auVar82._0_4_ * 3.0;
                        fVar198 = local_4a4 * local_4a4 * 3.0;
                        auVar187._0_4_ = fVar198 * (float)local_4d0._0_4_;
                        auVar187._4_4_ = fVar198 * (float)local_4d0._4_4_;
                        auVar187._8_4_ = fVar198 * (float)uStack_4c8;
                        auVar187._12_4_ = fVar198 * uStack_4c8._4_4_;
                        auVar189 = ZEXT1664(auVar187);
                        auVar160._4_4_ = fVar197;
                        auVar160._0_4_ = fVar197;
                        auVar160._8_4_ = fVar197;
                        auVar160._12_4_ = fVar197;
                        auVar79 = vfmadd132ps_fma(auVar160,auVar187,local_4f0);
                        auVar172._4_4_ = fVar196;
                        auVar172._0_4_ = fVar196;
                        auVar172._8_4_ = fVar196;
                        auVar172._12_4_ = fVar196;
                        auVar79 = vfmadd132ps_fma(auVar172,auVar79,local_4e0);
                        auVar161._4_4_ = fVar155;
                        auVar161._0_4_ = fVar155;
                        auVar161._8_4_ = fVar155;
                        auVar161._12_4_ = fVar155;
                        auVar79 = vfmadd132ps_fma(auVar161,auVar79,local_4c0);
                        local_4b0 = vmovlps_avx(auVar79);
                        local_4a8 = vextractps_avx(auVar79,2);
                        local_49c = (int)local_538;
                        local_498 = (int)local_550;
                        local_494 = (local_520.context)->instID[0];
                        local_490 = (local_520.context)->instPrimID[0];
                        local_554 = -1;
                        local_520.valid = &local_554;
                        local_520.geometryUserPtr = pGVar60->userPtr;
                        local_520.ray = (RTCRayN *)ray;
                        local_520.hit = (RTCHitN *)&local_4b0;
                        local_520.N = 1;
                        if (pGVar60->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0191a5ee:
                          p_Var11 = context->args->filter;
                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar60->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar183 = ZEXT1664(auVar183._0_16_);
                            auVar189 = ZEXT1664(auVar189._0_16_);
                            (*p_Var11)(&local_520);
                            auVar192 = ZEXT3264(local_400);
                            pGVar60 = (Geometry *)local_420._0_8_;
                            if (*local_520.valid == 0) goto LAB_0191a68a;
                          }
                          (((Vec3f *)((long)local_520.ray + 0x30))->field_0).components[0] =
                               *(float *)local_520.hit;
                          (((Vec3f *)((long)local_520.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_520.hit + 4);
                          (((Vec3f *)((long)local_520.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_520.hit + 8);
                          *(float *)((long)local_520.ray + 0x3c) = *(float *)(local_520.hit + 0xc);
                          *(float *)((long)local_520.ray + 0x40) = *(float *)(local_520.hit + 0x10);
                          *(float *)((long)local_520.ray + 0x44) = *(float *)(local_520.hit + 0x14);
                          *(float *)((long)local_520.ray + 0x48) = *(float *)(local_520.hit + 0x18);
                          *(float *)((long)local_520.ray + 0x4c) = *(float *)(local_520.hit + 0x1c);
                          *(float *)((long)local_520.ray + 0x50) = *(float *)(local_520.hit + 0x20);
                        }
                        else {
                          auVar183 = ZEXT464((uint)fVar155);
                          auVar189 = ZEXT1664(auVar187);
                          (*pGVar60->intersectionFilterN)(&local_520);
                          auVar192 = ZEXT3264(local_400);
                          pGVar60 = (Geometry *)local_420._0_8_;
                          if (*local_520.valid != 0) goto LAB_0191a5ee;
LAB_0191a68a:
                          (ray->super_RayK<1>).tfar = (float)local_3e0._0_4_;
                          pGVar60 = (Geometry *)local_420._0_8_;
                        }
                        bVar64 = ~(byte)(1 << ((uint)uVar56 & 0x1f)) & (byte)uVar66;
                        fVar155 = (ray->super_RayK<1>).tfar;
                        auVar31._4_4_ = fVar155;
                        auVar31._0_4_ = fVar155;
                        auVar31._8_4_ = fVar155;
                        auVar31._12_4_ = fVar155;
                        auVar31._16_4_ = fVar155;
                        auVar31._20_4_ = fVar155;
                        auVar31._24_4_ = fVar155;
                        auVar31._28_4_ = fVar155;
                        uVar147 = vcmpps_avx512vl(auVar192._0_32_,auVar31,2);
                        if ((bVar64 & (byte)uVar147) == 0) goto LAB_0191a732;
                        local_3e0 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                        bVar64 = bVar64 & (byte)uVar147;
                        uVar66 = (ulong)(uint)bVar64;
                        auVar145._8_4_ = 0x7f800000;
                        auVar145._0_8_ = 0x7f8000007f800000;
                        auVar145._12_4_ = 0x7f800000;
                        auVar145._16_4_ = 0x7f800000;
                        auVar145._20_4_ = 0x7f800000;
                        auVar145._24_4_ = 0x7f800000;
                        auVar145._28_4_ = 0x7f800000;
                        auVar99 = vblendmps_avx512vl(auVar145,auVar192._0_32_);
                        auVar129._0_4_ =
                             (uint)(bVar64 & 1) * auVar99._0_4_ |
                             (uint)!(bool)(bVar64 & 1) * 0x7f800000;
                        bVar12 = (bool)(bVar64 >> 1 & 1);
                        auVar129._4_4_ = (uint)bVar12 * auVar99._4_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar64 >> 2 & 1);
                        auVar129._8_4_ = (uint)bVar12 * auVar99._8_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar64 >> 3 & 1);
                        auVar129._12_4_ = (uint)bVar12 * auVar99._12_4_ | (uint)!bVar12 * 0x7f800000
                        ;
                        bVar12 = (bool)(bVar64 >> 4 & 1);
                        auVar129._16_4_ = (uint)bVar12 * auVar99._16_4_ | (uint)!bVar12 * 0x7f800000
                        ;
                        bVar12 = (bool)(bVar64 >> 5 & 1);
                        auVar129._20_4_ = (uint)bVar12 * auVar99._20_4_ | (uint)!bVar12 * 0x7f800000
                        ;
                        bVar12 = (bool)(bVar64 >> 6 & 1);
                        auVar129._24_4_ = (uint)bVar12 * auVar99._24_4_ | (uint)!bVar12 * 0x7f800000
                        ;
                        auVar129._28_4_ =
                             (uint)(bVar64 >> 7) * auVar99._28_4_ |
                             (uint)!(bool)(bVar64 >> 7) * 0x7f800000;
                        auVar99 = vshufps_avx(auVar129,auVar129,0xb1);
                        auVar99 = vminps_avx(auVar129,auVar99);
                        auVar103 = vshufpd_avx(auVar99,auVar99,5);
                        auVar99 = vminps_avx(auVar99,auVar103);
                        auVar103 = vpermpd_avx2(auVar99,0x4e);
                        auVar99 = vminps_avx(auVar99,auVar103);
                        uVar147 = vcmpps_avx512vl(auVar129,auVar99,0);
                        bVar55 = (byte)uVar147 & bVar64;
                        uVar65 = (uint)bVar64;
                        if (bVar55 != 0) {
                          uVar65 = (uint)bVar55;
                        }
                        uVar58 = 0;
                        for (; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x80000000) {
                          uVar58 = uVar58 + 1;
                        }
                        uVar56 = (ulong)uVar58;
                      } while( true );
                    }
                    fVar155 = local_1c0[uVar56];
                    fVar196 = *(float *)(local_1a0 + uVar56 * 4);
                    fVar198 = 1.0 - fVar155;
                    fVar197 = fVar198 * fVar198 * -3.0;
                    auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar198 * fVar198)),
                                              ZEXT416((uint)(fVar155 * fVar198)),ZEXT416(0xc0000000)
                                             );
                    auVar82 = vfmsub132ss_fma(ZEXT416((uint)(fVar155 * fVar198)),
                                              ZEXT416((uint)(fVar155 * fVar155)),ZEXT416(0x40000000)
                                             );
                    fVar198 = auVar79._0_4_ * 3.0;
                    fVar199 = auVar82._0_4_ * 3.0;
                    fVar166 = fVar155 * fVar155 * 3.0;
                    auVar186._0_4_ = fVar166 * (float)local_4d0._0_4_;
                    auVar186._4_4_ = fVar166 * (float)local_4d0._4_4_;
                    auVar186._8_4_ = fVar166 * (float)uStack_4c8;
                    auVar186._12_4_ = fVar166 * uStack_4c8._4_4_;
                    auVar189 = ZEXT1664(auVar186);
                    auVar158._4_4_ = fVar199;
                    auVar158._0_4_ = fVar199;
                    auVar158._8_4_ = fVar199;
                    auVar158._12_4_ = fVar199;
                    auVar79 = vfmadd132ps_fma(auVar158,auVar186,local_4f0);
                    auVar171._4_4_ = fVar198;
                    auVar171._0_4_ = fVar198;
                    auVar171._8_4_ = fVar198;
                    auVar171._12_4_ = fVar198;
                    auVar79 = vfmadd132ps_fma(auVar171,auVar79,local_4e0);
                    auVar159._4_4_ = fVar197;
                    auVar159._0_4_ = fVar197;
                    auVar159._8_4_ = fVar197;
                    auVar159._12_4_ = fVar197;
                    auVar183 = ZEXT464((uint)*(float *)(local_180 + uVar56 * 4));
                    (ray->super_RayK<1>).tfar = *(float *)(local_180 + uVar56 * 4);
                    auVar79 = vfmadd132ps_fma(auVar159,auVar79,local_4c0);
                    uVar147 = vmovlps_avx(auVar79);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar147;
                    fVar197 = (float)vextractps_avx(auVar79,2);
                    (ray->Ng).field_0.field_0.z = fVar197;
                    ray->u = fVar155;
                    ray->v = fVar196;
                    ray->primID = (uint)local_538;
                    ray->geomID = (uint)local_550;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_0191a43d;
      }
    }
    fVar155 = (ray->super_RayK<1>).tfar;
    auVar23._4_4_ = fVar155;
    auVar23._0_4_ = fVar155;
    auVar23._8_4_ = fVar155;
    auVar23._12_4_ = fVar155;
    uVar147 = vcmpps_avx512vl(auVar220._0_16_,auVar23,2);
    local_548 = (ulong)((uint)local_548 & (uint)local_548 + 0xf & (uint)uVar147);
  } while( true );
LAB_0191a732:
  auVar79 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar219 = ZEXT1664(auVar79);
  auVar220 = ZEXT1664(local_480);
  auVar79 = vbroadcastss_avx512vl(ZEXT416(0xbeaaaaab));
  auVar221 = ZEXT1664(auVar79);
  auVar99 = vmovdqa64_avx512vl(local_100);
  auVar218 = ZEXT3264(auVar99);
  auVar217 = ZEXT3264(local_120);
  prim = local_530;
  lVar62 = local_468;
LAB_0191a43d:
  lVar59 = lVar59 + 8;
  goto LAB_01919b97;
}

Assistant:

static __forceinline void intersect_h(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time());
          Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }